

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-template-64.h
# Opt level: O1

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  ulong uVar130;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  ulong uVar134;
  ulong uVar135;
  ulong uVar136;
  ulong uVar137;
  ulong uVar138;
  ulong uVar139;
  ulong uVar140;
  ulong uVar141;
  ulong uVar142;
  ulong uVar143;
  ulong uVar144;
  ulong uVar145;
  ulong uVar146;
  ulong uVar147;
  ulong uVar148;
  ulong uVar149;
  ulong uVar150;
  ulong uVar151;
  ulong uVar152;
  ulong uVar153;
  ulong uVar154;
  ulong uVar155;
  ulong uVar156;
  ulong uVar157;
  ulong uVar158;
  ulong uVar159;
  ulong uVar160;
  ulong uVar161;
  ulong uVar162;
  ulong uVar163;
  ulong uVar164;
  ulong uVar165;
  ulong uVar166;
  ulong uVar167;
  ulong uVar168;
  ulong uVar169;
  ulong uVar170;
  ulong uVar171;
  ulong uVar172;
  ulong uVar173;
  ulong uVar174;
  ulong uVar175;
  ulong uVar176;
  ulong uVar177;
  ulong uVar178;
  ulong uVar179;
  ulong uVar180;
  ulong uVar181;
  ulong uVar182;
  ulong uVar183;
  ulong uVar184;
  ulong uVar185;
  ulong uVar186;
  ulong uVar187;
  ulong uVar188;
  ulong uVar189;
  ulong uVar190;
  ulong uVar191;
  ulong uVar192;
  ulong uVar193;
  ulong uVar194;
  ulong uVar195;
  ulong uVar196;
  block block_tmp;
  block blockR;
  block local_830;
  block local_430;
  
  copy_block(&local_430,ref_block);
  xor_block(&local_430,prev_block);
  copy_block(&local_830,&local_430);
  if (with_xor != 0) {
    xor_block(&local_830,next_block);
  }
  uVar26 = (local_430.v[4] & 0xffffffff) * (local_430.v[0] & 0xffffffff) * 2 +
           local_430.v[4] + local_430.v[0];
  uVar5 = (local_430.v[0xc] ^ uVar26) >> 0x20;
  uVar169 = (local_430.v[0xc] ^ uVar26) << 0x20 | uVar5;
  uVar27 = uVar5 * (local_430.v[8] & 0xffffffff) * 2 + uVar169 + local_430.v[8];
  uVar5 = (local_430.v[4] ^ uVar27) >> 0x18;
  uVar142 = (local_430.v[4] ^ uVar27) << 0x28 | uVar5;
  uVar129 = (uVar5 & 0xffffffff) * (uVar26 & 0xffffffff) * 2 + uVar142 + uVar26;
  uVar169 = uVar169 ^ uVar129;
  uVar5 = uVar169 >> 0x10;
  uVar170 = uVar169 << 0x30 | uVar5;
  uVar72 = (uVar5 & 0xffffffff) * (uVar27 & 0xffffffff) * 2 + uVar170 + uVar27;
  uVar142 = uVar142 ^ uVar72;
  uVar5 = uVar142 << 1;
  uVar169 = (ulong)((long)uVar142 < 0);
  uVar143 = uVar5 | uVar169;
  uVar27 = (local_430.v[5] & 0xffffffff) * (local_430.v[1] & 0xffffffff) * 2 +
           local_430.v[5] + local_430.v[1];
  uVar26 = (local_430.v[0xd] ^ uVar27) >> 0x20;
  uVar188 = (local_430.v[0xd] ^ uVar27) << 0x20 | uVar26;
  uVar142 = uVar26 * (local_430.v[9] & 0xffffffff) * 2 + uVar188 + local_430.v[9];
  uVar26 = (local_430.v[5] ^ uVar142) >> 0x18;
  uVar145 = (local_430.v[5] ^ uVar142) << 0x28 | uVar26;
  uVar73 = (uVar26 & 0xffffffff) * (uVar27 & 0xffffffff) * 2 + uVar145 + uVar27;
  uVar188 = uVar188 ^ uVar73;
  uVar26 = uVar188 >> 0x10;
  uVar189 = uVar188 << 0x30 | uVar26;
  uVar28 = (uVar26 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar189 + uVar142;
  uVar145 = uVar145 ^ uVar28;
  uVar26 = uVar145 << 1;
  uVar142 = (ulong)((long)uVar145 < 0);
  uVar146 = uVar26 | uVar142;
  uVar145 = (local_430.v[6] & 0xffffffff) * (local_430.v[2] & 0xffffffff) * 2 +
            local_430.v[6] + local_430.v[2];
  uVar27 = (local_430.v[0xe] ^ uVar145) >> 0x20;
  uVar65 = (local_430.v[0xe] ^ uVar145) << 0x20 | uVar27;
  uVar188 = uVar27 * (local_430.v[10] & 0xffffffff) * 2 + uVar65 + local_430.v[10];
  uVar27 = (local_430.v[6] ^ uVar188) >> 0x18;
  uVar152 = (local_430.v[6] ^ uVar188) << 0x28 | uVar27;
  uVar74 = (uVar27 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar152 + uVar145;
  uVar65 = uVar65 ^ uVar74;
  uVar27 = uVar65 >> 0x10;
  uVar66 = uVar65 << 0x30 | uVar27;
  uVar130 = (uVar27 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar66 + uVar188;
  uVar152 = uVar152 ^ uVar130;
  uVar27 = uVar152 << 1;
  uVar145 = (ulong)((long)uVar152 < 0);
  uVar153 = uVar27 | uVar145;
  uVar65 = (local_430.v[7] & 0xffffffff) * (local_430.v[3] & 0xffffffff) * 2 +
           local_430.v[3] + local_430.v[7];
  uVar188 = (local_430.v[0xf] ^ uVar65) >> 0x20;
  uVar69 = (local_430.v[0xf] ^ uVar65) << 0x20 | uVar188;
  uVar152 = uVar188 * (local_430.v[0xb] & 0xffffffff) * 2 + local_430.v[0xb] + uVar69;
  uVar188 = (local_430.v[7] ^ uVar152) >> 0x18;
  uVar159 = (local_430.v[7] ^ uVar152) << 0x28 | uVar188;
  uVar180 = (uVar188 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar65 + uVar159;
  uVar69 = uVar69 ^ uVar180;
  uVar188 = uVar69 >> 0x10;
  uVar65 = uVar69 << 0x30 | uVar188;
  uVar129 = (uVar26 & 0xffffffff | uVar142) * (uVar129 & 0xffffffff) * 2 + uVar146 + uVar129;
  uVar152 = (uVar188 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar65 + uVar152;
  uVar65 = uVar65 ^ uVar129;
  uVar26 = uVar65 >> 0x20;
  uVar69 = uVar65 << 0x20 | uVar26;
  uVar130 = uVar26 * (uVar130 & 0xffffffff) * 2 + uVar69 + uVar130;
  uVar146 = uVar146 ^ uVar130;
  uVar142 = uVar146 >> 0x18;
  uVar65 = uVar146 << 0x28 | uVar142;
  uVar159 = uVar159 ^ uVar152;
  uVar26 = uVar159 << 1;
  uVar188 = (ulong)((long)uVar159 < 0);
  uVar146 = uVar26 | uVar188;
  uVar129 = (uVar142 & 0xffffffff) * (uVar129 & 0xffffffff) * 2 + uVar65 + uVar129;
  uVar69 = uVar129 ^ uVar69;
  uVar6 = uVar69 >> 0x10;
  uVar131 = uVar69 << 0x30 | uVar6;
  uVar29 = (uVar6 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + uVar131 + uVar130;
  uVar65 = uVar29 ^ uVar65;
  uVar142 = uVar65 << 1;
  uVar127 = (ulong)((long)uVar65 < 0);
  uVar145 = (uVar27 & 0xffffffff | uVar145) * (uVar73 & 0xffffffff) * 2 + uVar153 + uVar73;
  uVar170 = uVar170 ^ uVar145;
  uVar27 = uVar170 >> 0x20;
  uVar130 = uVar170 << 0x20 | uVar27;
  uVar65 = uVar27 * (uVar152 & 0xffffffff) * 2 + uVar152 + uVar130;
  uVar153 = uVar153 ^ uVar65;
  uVar27 = uVar153 >> 0x18;
  uVar152 = uVar153 << 0x28 | uVar27;
  uVar75 = (uVar27 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar152 + uVar145;
  uVar130 = uVar75 ^ uVar130;
  uVar7 = uVar130 >> 0x10;
  uVar76 = uVar130 << 0x30 | uVar7;
  uVar30 = (uVar7 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar76 + uVar65;
  uVar152 = uVar30 ^ uVar152;
  uVar27 = uVar152 << 1;
  uVar1 = (ulong)((long)uVar152 < 0);
  uVar145 = (uVar26 & 0xffffffff | uVar188) * (uVar74 & 0xffffffff) * 2 + uVar146 + uVar74;
  uVar189 = uVar189 ^ uVar145;
  uVar26 = uVar189 >> 0x20;
  uVar152 = uVar189 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar72 & 0xffffffff) * 2 + uVar152 + uVar72;
  uVar146 = uVar146 ^ uVar188;
  uVar26 = uVar146 >> 0x18;
  uVar65 = uVar146 << 0x28 | uVar26;
  uVar77 = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar65 + uVar145;
  uVar152 = uVar77 ^ uVar152;
  uVar8 = uVar152 >> 0x10;
  uVar78 = uVar152 << 0x30 | uVar8;
  uVar31 = (uVar8 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar78 + uVar188;
  uVar65 = uVar31 ^ uVar65;
  uVar26 = uVar65 << 1;
  uVar2 = (ulong)((long)uVar65 < 0);
  uVar169 = (uVar5 & 0xffffffff | uVar169) * (uVar180 & 0xffffffff) * 2 + uVar180 + uVar143;
  uVar66 = uVar66 ^ uVar169;
  uVar5 = uVar66 >> 0x20;
  uVar65 = uVar66 << 0x20 | uVar5;
  uVar145 = uVar5 * (uVar28 & 0xffffffff) * 2 + uVar65 + uVar28;
  uVar143 = uVar143 ^ uVar145;
  uVar5 = uVar143 >> 0x18;
  uVar188 = uVar143 << 0x28 | uVar5;
  uVar79 = (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + uVar188 + uVar169;
  uVar65 = uVar79 ^ uVar65;
  uVar9 = uVar65 >> 0x10;
  uVar80 = uVar65 << 0x30 | uVar9;
  uVar32 = (uVar9 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar80 + uVar145;
  uVar188 = uVar32 ^ uVar188;
  uVar5 = uVar188 << 1;
  uVar124 = (ulong)((long)uVar188 < 0);
  uVar145 = (local_430.v[0x14] & 0xffffffff) * (local_430.v[0x10] & 0xffffffff) * 2 +
            local_430.v[0x14] + local_430.v[0x10];
  uVar169 = (local_430.v[0x1c] ^ uVar145) >> 0x20;
  uVar152 = (local_430.v[0x1c] ^ uVar145) << 0x20 | uVar169;
  uVar188 = uVar169 * (local_430.v[0x18] & 0xffffffff) * 2 + uVar152 + local_430.v[0x18];
  uVar169 = (local_430.v[0x14] ^ uVar188) >> 0x18;
  uVar65 = (local_430.v[0x14] ^ uVar188) << 0x28 | uVar169;
  uVar81 = (uVar169 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar65 + uVar145;
  uVar152 = uVar152 ^ uVar81;
  uVar169 = uVar152 >> 0x10;
  uVar171 = uVar152 << 0x30 | uVar169;
  uVar73 = (uVar169 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar171 + uVar188;
  uVar65 = uVar65 ^ uVar73;
  uVar169 = uVar65 << 1;
  uVar152 = (ulong)((long)uVar65 < 0);
  uVar170 = uVar169 | uVar152;
  uVar188 = (local_430.v[0x15] & 0xffffffff) * (local_430.v[0x11] & 0xffffffff) * 2 +
            local_430.v[0x15] + local_430.v[0x11];
  uVar145 = (local_430.v[0x1d] ^ uVar188) >> 0x20;
  uVar28 = (local_430.v[0x1d] ^ uVar188) << 0x20 | uVar145;
  uVar65 = uVar145 * (local_430.v[0x19] & 0xffffffff) * 2 + uVar28 + local_430.v[0x19];
  uVar145 = (local_430.v[0x15] ^ uVar65) >> 0x18;
  uVar130 = (local_430.v[0x15] ^ uVar65) << 0x28 | uVar145;
  uVar153 = (uVar145 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar130 + uVar188;
  uVar28 = uVar28 ^ uVar153;
  uVar145 = uVar28 >> 0x10;
  uVar190 = uVar28 << 0x30 | uVar145;
  uVar74 = (uVar145 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar190 + uVar65;
  uVar130 = uVar130 ^ uVar74;
  uVar145 = uVar130 << 1;
  uVar65 = (ulong)((long)uVar130 < 0);
  uVar180 = uVar145 | uVar65;
  uVar130 = (local_430.v[0x16] & 0xffffffff) * (local_430.v[0x12] & 0xffffffff) * 2 +
            local_430.v[0x16] + local_430.v[0x12];
  uVar188 = (local_430.v[0x1e] ^ uVar130) >> 0x20;
  uVar66 = (local_430.v[0x1e] ^ uVar130) << 0x20 | uVar188;
  uVar28 = uVar188 * (local_430.v[0x1a] & 0xffffffff) * 2 + uVar66 + local_430.v[0x1a];
  uVar188 = (local_430.v[0x16] ^ uVar28) >> 0x18;
  uVar69 = (local_430.v[0x16] ^ uVar28) << 0x28 | uVar188;
  uVar159 = (uVar188 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + uVar69 + uVar130;
  uVar66 = uVar66 ^ uVar159;
  uVar188 = uVar66 >> 0x10;
  uVar143 = uVar66 << 0x30 | uVar188;
  uVar72 = (uVar188 & 0xffffffff) * (uVar28 & 0xffffffff) * 2 + uVar143 + uVar28;
  uVar69 = uVar69 ^ uVar72;
  uVar188 = uVar69 << 1;
  uVar130 = (ulong)((long)uVar69 < 0);
  uVar189 = uVar188 | uVar130;
  uVar66 = (local_430.v[0x17] & 0xffffffff) * (local_430.v[0x13] & 0xffffffff) * 2 +
           local_430.v[0x13] + local_430.v[0x17];
  uVar28 = (local_430.v[0x1f] ^ uVar66) >> 0x20;
  uVar146 = (local_430.v[0x1f] ^ uVar66) << 0x20 | uVar28;
  uVar69 = uVar28 * (local_430.v[0x1b] & 0xffffffff) * 2 + local_430.v[0x1b] + uVar146;
  uVar28 = (local_430.v[0x17] ^ uVar69) >> 0x18;
  uVar160 = (local_430.v[0x17] ^ uVar69) << 0x28 | uVar28;
  uVar181 = (uVar28 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar66 + uVar160;
  uVar146 = uVar146 ^ uVar181;
  uVar28 = uVar146 >> 0x10;
  uVar66 = uVar146 << 0x30 | uVar28;
  uVar81 = (uVar145 & 0xffffffff | uVar65) * (uVar81 & 0xffffffff) * 2 + uVar180 + uVar81;
  uVar69 = (uVar28 & 0xffffffff) * (uVar69 & 0xffffffff) * 2 + uVar66 + uVar69;
  uVar66 = uVar66 ^ uVar81;
  uVar145 = uVar66 >> 0x20;
  uVar146 = uVar66 << 0x20 | uVar145;
  uVar72 = uVar145 * (uVar72 & 0xffffffff) * 2 + uVar146 + uVar72;
  uVar180 = uVar180 ^ uVar72;
  uVar65 = uVar180 >> 0x18;
  uVar66 = uVar180 << 0x28 | uVar65;
  uVar160 = uVar160 ^ uVar69;
  uVar145 = uVar160 << 1;
  uVar28 = (ulong)((long)uVar160 < 0);
  uVar180 = uVar145 | uVar28;
  uVar81 = (uVar65 & 0xffffffff) * (uVar81 & 0xffffffff) * 2 + uVar66 + uVar81;
  uVar146 = uVar81 ^ uVar146;
  uVar10 = uVar146 >> 0x10;
  uVar132 = uVar146 << 0x30 | uVar10;
  uVar33 = (uVar10 & 0xffffffff) * (uVar72 & 0xffffffff) * 2 + uVar132 + uVar72;
  uVar66 = uVar33 ^ uVar66;
  uVar65 = uVar66 << 1;
  uVar128 = (ulong)((long)uVar66 < 0);
  uVar130 = (uVar188 & 0xffffffff | uVar130) * (uVar153 & 0xffffffff) * 2 + uVar189 + uVar153;
  uVar171 = uVar171 ^ uVar130;
  uVar188 = uVar171 >> 0x20;
  uVar72 = uVar171 << 0x20 | uVar188;
  uVar66 = uVar188 * (uVar69 & 0xffffffff) * 2 + uVar69 + uVar72;
  uVar189 = uVar189 ^ uVar66;
  uVar188 = uVar189 >> 0x18;
  uVar69 = uVar189 << 0x28 | uVar188;
  uVar82 = (uVar188 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + uVar69 + uVar130;
  uVar72 = uVar82 ^ uVar72;
  uVar11 = uVar72 >> 0x10;
  uVar83 = uVar72 << 0x30 | uVar11;
  uVar34 = (uVar11 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar83 + uVar66;
  uVar69 = uVar34 ^ uVar69;
  uVar188 = uVar69 << 1;
  uVar3 = (ulong)((long)uVar69 < 0);
  uVar130 = (uVar145 & 0xffffffff | uVar28) * (uVar159 & 0xffffffff) * 2 + uVar180 + uVar159;
  uVar190 = uVar190 ^ uVar130;
  uVar145 = uVar190 >> 0x20;
  uVar69 = uVar190 << 0x20 | uVar145;
  uVar28 = uVar145 * (uVar73 & 0xffffffff) * 2 + uVar69 + uVar73;
  uVar180 = uVar180 ^ uVar28;
  uVar145 = uVar180 >> 0x18;
  uVar66 = uVar180 << 0x28 | uVar145;
  uVar84 = (uVar145 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + uVar66 + uVar130;
  uVar69 = uVar84 ^ uVar69;
  uVar12 = uVar69 >> 0x10;
  uVar85 = uVar69 << 0x30 | uVar12;
  uVar35 = (uVar12 & 0xffffffff) * (uVar28 & 0xffffffff) * 2 + uVar85 + uVar28;
  uVar66 = uVar35 ^ uVar66;
  uVar145 = uVar66 << 1;
  uVar4 = (ulong)((long)uVar66 < 0);
  uVar152 = (uVar169 & 0xffffffff | uVar152) * (uVar181 & 0xffffffff) * 2 + uVar181 + uVar170;
  uVar143 = uVar143 ^ uVar152;
  uVar169 = uVar143 >> 0x20;
  uVar66 = uVar143 << 0x20 | uVar169;
  uVar130 = uVar169 * (uVar74 & 0xffffffff) * 2 + uVar66 + uVar74;
  uVar170 = uVar170 ^ uVar130;
  uVar169 = uVar170 >> 0x18;
  uVar28 = uVar170 << 0x28 | uVar169;
  uVar86 = (uVar169 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar28 + uVar152;
  uVar66 = uVar86 ^ uVar66;
  uVar13 = uVar66 >> 0x10;
  uVar87 = uVar66 << 0x30 | uVar13;
  uVar36 = (uVar13 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + uVar87 + uVar130;
  uVar28 = uVar36 ^ uVar28;
  uVar169 = uVar28 << 1;
  uVar126 = (ulong)((long)uVar28 < 0);
  uVar130 = (local_430.v[0x24] & 0xffffffff) * (local_430.v[0x20] & 0xffffffff) * 2 +
            local_430.v[0x24] + local_430.v[0x20];
  uVar152 = (local_430.v[0x2c] ^ uVar130) >> 0x20;
  uVar69 = (local_430.v[0x2c] ^ uVar130) << 0x20 | uVar152;
  uVar28 = uVar152 * (local_430.v[0x28] & 0xffffffff) * 2 + uVar69 + local_430.v[0x28];
  uVar152 = (local_430.v[0x24] ^ uVar28) >> 0x18;
  uVar66 = (local_430.v[0x24] ^ uVar28) << 0x28 | uVar152;
  uVar88 = (uVar152 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + uVar66 + uVar130;
  uVar69 = uVar69 ^ uVar88;
  uVar152 = uVar69 >> 0x10;
  uVar172 = uVar69 << 0x30 | uVar152;
  uVar153 = (uVar152 & 0xffffffff) * (uVar28 & 0xffffffff) * 2 + uVar172 + uVar28;
  uVar66 = uVar66 ^ uVar153;
  uVar152 = uVar66 << 1;
  uVar69 = (ulong)((long)uVar66 < 0);
  uVar171 = uVar152 | uVar69;
  uVar28 = (local_430.v[0x25] & 0xffffffff) * (local_430.v[0x21] & 0xffffffff) * 2 +
           local_430.v[0x25] + local_430.v[0x21];
  uVar130 = (local_430.v[0x2d] ^ uVar28) >> 0x20;
  uVar73 = (local_430.v[0x2d] ^ uVar28) << 0x20 | uVar130;
  uVar66 = uVar130 * (local_430.v[0x29] & 0xffffffff) * 2 + uVar73 + local_430.v[0x29];
  uVar130 = (local_430.v[0x25] ^ uVar66) >> 0x18;
  uVar72 = (local_430.v[0x25] ^ uVar66) << 0x28 | uVar130;
  uVar189 = (uVar130 & 0xffffffff) * (uVar28 & 0xffffffff) * 2 + uVar72 + uVar28;
  uVar73 = uVar73 ^ uVar189;
  uVar130 = uVar73 >> 0x10;
  uVar191 = uVar73 << 0x30 | uVar130;
  uVar159 = (uVar130 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar191 + uVar66;
  uVar72 = uVar72 ^ uVar159;
  uVar130 = uVar72 << 1;
  uVar66 = (ulong)((long)uVar72 < 0);
  uVar181 = uVar130 | uVar66;
  uVar72 = (local_430.v[0x26] & 0xffffffff) * (local_430.v[0x22] & 0xffffffff) * 2 +
           local_430.v[0x26] + local_430.v[0x22];
  uVar28 = (local_430.v[0x2e] ^ uVar72) >> 0x20;
  uVar74 = (local_430.v[0x2e] ^ uVar72) << 0x20 | uVar28;
  uVar73 = uVar28 * (local_430.v[0x2a] & 0xffffffff) * 2 + uVar74 + local_430.v[0x2a];
  uVar28 = (local_430.v[0x26] ^ uVar73) >> 0x18;
  uVar143 = (local_430.v[0x26] ^ uVar73) << 0x28 | uVar28;
  uVar160 = (uVar28 & 0xffffffff) * (uVar72 & 0xffffffff) * 2 + uVar143 + uVar72;
  uVar74 = uVar74 ^ uVar160;
  uVar28 = uVar74 >> 0x10;
  uVar170 = uVar74 << 0x30 | uVar28;
  uVar146 = (uVar28 & 0xffffffff) * (uVar73 & 0xffffffff) * 2 + uVar170 + uVar73;
  uVar143 = uVar143 ^ uVar146;
  uVar28 = uVar143 << 1;
  uVar72 = (ulong)((long)uVar143 < 0);
  uVar190 = uVar28 | uVar72;
  uVar74 = (local_430.v[0x27] & 0xffffffff) * (local_430.v[0x23] & 0xffffffff) * 2 +
           local_430.v[0x23] + local_430.v[0x27];
  uVar73 = (local_430.v[0x2f] ^ uVar74) >> 0x20;
  uVar180 = (local_430.v[0x2f] ^ uVar74) << 0x20 | uVar73;
  uVar143 = uVar73 * (local_430.v[0x2b] & 0xffffffff) * 2 + local_430.v[0x2b] + uVar180;
  uVar73 = (local_430.v[0x27] ^ uVar143) >> 0x18;
  uVar161 = (local_430.v[0x27] ^ uVar143) << 0x28 | uVar73;
  uVar182 = (uVar73 & 0xffffffff) * (uVar74 & 0xffffffff) * 2 + uVar74 + uVar161;
  uVar180 = uVar180 ^ uVar182;
  uVar73 = uVar180 >> 0x10;
  uVar74 = uVar180 << 0x30 | uVar73;
  uVar88 = (uVar130 & 0xffffffff | uVar66) * (uVar88 & 0xffffffff) * 2 + uVar181 + uVar88;
  uVar143 = (uVar73 & 0xffffffff) * (uVar143 & 0xffffffff) * 2 + uVar74 + uVar143;
  uVar74 = uVar74 ^ uVar88;
  uVar130 = uVar74 >> 0x20;
  uVar180 = uVar74 << 0x20 | uVar130;
  uVar146 = uVar130 * (uVar146 & 0xffffffff) * 2 + uVar180 + uVar146;
  uVar181 = uVar181 ^ uVar146;
  uVar66 = uVar181 >> 0x18;
  uVar74 = uVar181 << 0x28 | uVar66;
  uVar161 = uVar161 ^ uVar143;
  uVar130 = uVar161 << 1;
  uVar73 = (ulong)((long)uVar161 < 0);
  uVar181 = uVar130 | uVar73;
  uVar88 = (uVar66 & 0xffffffff) * (uVar88 & 0xffffffff) * 2 + uVar74 + uVar88;
  uVar180 = uVar88 ^ uVar180;
  uVar14 = uVar180 >> 0x10;
  uVar133 = uVar180 << 0x30 | uVar14;
  uVar37 = (uVar14 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar133 + uVar146;
  uVar74 = uVar37 ^ uVar74;
  uVar66 = uVar74 << 1;
  uVar125 = (ulong)((long)uVar74 < 0);
  uVar38 = uVar66 | uVar125;
  uVar72 = (uVar28 & 0xffffffff | uVar72) * (uVar189 & 0xffffffff) * 2 + uVar190 + uVar189;
  uVar172 = uVar172 ^ uVar72;
  uVar28 = uVar172 >> 0x20;
  uVar146 = uVar172 << 0x20 | uVar28;
  uVar74 = uVar28 * (uVar143 & 0xffffffff) * 2 + uVar143 + uVar146;
  uVar190 = uVar190 ^ uVar74;
  uVar28 = uVar190 >> 0x18;
  uVar143 = uVar190 << 0x28 | uVar28;
  uVar89 = (uVar28 & 0xffffffff) * (uVar72 & 0xffffffff) * 2 + uVar143 + uVar72;
  uVar146 = uVar89 ^ uVar146;
  uVar15 = uVar146 >> 0x10;
  uVar90 = uVar146 << 0x30 | uVar15;
  uVar39 = (uVar15 & 0xffffffff) * (uVar74 & 0xffffffff) * 2 + uVar90 + uVar74;
  uVar143 = uVar39 ^ uVar143;
  uVar28 = uVar143 << 1;
  uVar172 = (ulong)((long)uVar143 < 0);
  uVar40 = uVar28 | uVar172;
  uVar72 = (uVar130 & 0xffffffff | uVar73) * (uVar160 & 0xffffffff) * 2 + uVar181 + uVar160;
  uVar191 = uVar191 ^ uVar72;
  uVar130 = uVar191 >> 0x20;
  uVar143 = uVar191 << 0x20 | uVar130;
  uVar73 = uVar130 * (uVar153 & 0xffffffff) * 2 + uVar143 + uVar153;
  uVar181 = uVar181 ^ uVar73;
  uVar130 = uVar181 >> 0x18;
  uVar74 = uVar181 << 0x28 | uVar130;
  uVar91 = (uVar130 & 0xffffffff) * (uVar72 & 0xffffffff) * 2 + uVar74 + uVar72;
  uVar143 = uVar91 ^ uVar143;
  uVar16 = uVar143 >> 0x10;
  uVar92 = uVar143 << 0x30 | uVar16;
  uVar41 = (uVar16 & 0xffffffff) * (uVar73 & 0xffffffff) * 2 + uVar92 + uVar73;
  uVar74 = uVar41 ^ uVar74;
  uVar130 = uVar74 << 1;
  uVar191 = (ulong)((long)uVar74 < 0);
  uVar42 = uVar130 | uVar191;
  uVar69 = (uVar152 & 0xffffffff | uVar69) * (uVar182 & 0xffffffff) * 2 + uVar182 + uVar171;
  uVar170 = uVar170 ^ uVar69;
  uVar152 = uVar170 >> 0x20;
  uVar74 = uVar170 << 0x20 | uVar152;
  uVar72 = uVar152 * (uVar159 & 0xffffffff) * 2 + uVar74 + uVar159;
  uVar171 = uVar171 ^ uVar72;
  uVar152 = uVar171 >> 0x18;
  uVar73 = uVar171 << 0x28 | uVar152;
  uVar93 = (uVar152 & 0xffffffff) * (uVar69 & 0xffffffff) * 2 + uVar73 + uVar69;
  uVar74 = uVar93 ^ uVar74;
  uVar17 = uVar74 >> 0x10;
  uVar94 = uVar74 << 0x30 | uVar17;
  uVar43 = (uVar17 & 0xffffffff) * (uVar72 & 0xffffffff) * 2 + uVar94 + uVar72;
  uVar73 = uVar43 ^ uVar73;
  uVar152 = uVar73 << 1;
  uVar182 = (ulong)((long)uVar73 < 0);
  uVar44 = uVar152 | uVar182;
  uVar72 = (local_430.v[0x34] & 0xffffffff) * (local_430.v[0x30] & 0xffffffff) * 2 +
           local_430.v[0x34] + local_430.v[0x30];
  uVar69 = (local_430.v[0x3c] ^ uVar72) >> 0x20;
  uVar143 = (local_430.v[0x3c] ^ uVar72) << 0x20 | uVar69;
  uVar73 = uVar69 * (local_430.v[0x38] & 0xffffffff) * 2 + uVar143 + local_430.v[0x38];
  uVar69 = (local_430.v[0x34] ^ uVar73) >> 0x18;
  uVar74 = (local_430.v[0x34] ^ uVar73) << 0x28 | uVar69;
  uVar95 = (uVar69 & 0xffffffff) * (uVar72 & 0xffffffff) * 2 + uVar74 + uVar72;
  uVar143 = uVar143 ^ uVar95;
  uVar69 = uVar143 >> 0x10;
  uVar173 = uVar143 << 0x30 | uVar69;
  uVar189 = (uVar69 & 0xffffffff) * (uVar73 & 0xffffffff) * 2 + uVar173 + uVar73;
  uVar74 = uVar74 ^ uVar189;
  uVar69 = uVar74 << 1;
  uVar143 = (ulong)((long)uVar74 < 0);
  uVar134 = uVar69 | uVar143;
  uVar73 = (local_430.v[0x35] & 0xffffffff) * (local_430.v[0x31] & 0xffffffff) * 2 +
           local_430.v[0x35] + local_430.v[0x31];
  uVar72 = (local_430.v[0x3d] ^ uVar73) >> 0x20;
  uVar153 = (local_430.v[0x3d] ^ uVar73) << 0x20 | uVar72;
  uVar74 = uVar72 * (local_430.v[0x39] & 0xffffffff) * 2 + uVar153 + local_430.v[0x39];
  uVar72 = (local_430.v[0x35] ^ uVar74) >> 0x18;
  uVar146 = (local_430.v[0x35] ^ uVar74) << 0x28 | uVar72;
  uVar190 = (uVar72 & 0xffffffff) * (uVar73 & 0xffffffff) * 2 + uVar146 + uVar73;
  uVar153 = uVar153 ^ uVar190;
  uVar72 = uVar153 >> 0x10;
  uVar192 = uVar153 << 0x30 | uVar72;
  uVar160 = (uVar72 & 0xffffffff) * (uVar74 & 0xffffffff) * 2 + uVar192 + uVar74;
  uVar146 = uVar146 ^ uVar160;
  uVar72 = uVar146 << 1;
  uVar74 = (ulong)((long)uVar146 < 0);
  uVar147 = uVar72 | uVar74;
  uVar146 = (local_430.v[0x36] & 0xffffffff) * (local_430.v[0x32] & 0xffffffff) * 2 +
            local_430.v[0x36] + local_430.v[0x32];
  uVar73 = (local_430.v[0x3e] ^ uVar146) >> 0x20;
  uVar159 = (local_430.v[0x3e] ^ uVar146) << 0x20 | uVar73;
  uVar153 = uVar73 * (local_430.v[0x3a] & 0xffffffff) * 2 + uVar159 + local_430.v[0x3a];
  uVar73 = (local_430.v[0x36] ^ uVar153) >> 0x18;
  uVar170 = (local_430.v[0x36] ^ uVar153) << 0x28 | uVar73;
  uVar161 = (uVar73 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar170 + uVar146;
  uVar159 = uVar159 ^ uVar161;
  uVar73 = uVar159 >> 0x10;
  uVar171 = uVar159 << 0x30 | uVar73;
  uVar180 = (uVar73 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar171 + uVar153;
  uVar170 = uVar170 ^ uVar180;
  uVar73 = uVar170 << 1;
  uVar146 = (ulong)((long)uVar170 < 0);
  uVar154 = uVar73 | uVar146;
  uVar159 = (local_430.v[0x37] & 0xffffffff) * (local_430.v[0x33] & 0xffffffff) * 2 +
            local_430.v[0x33] + local_430.v[0x37];
  uVar153 = (local_430.v[0x3f] ^ uVar159) >> 0x20;
  uVar181 = (local_430.v[0x3f] ^ uVar159) << 0x20 | uVar153;
  uVar170 = uVar153 * (local_430.v[0x3b] & 0xffffffff) * 2 + local_430.v[0x3b] + uVar181;
  uVar153 = (local_430.v[0x37] ^ uVar170) >> 0x18;
  uVar162 = (local_430.v[0x37] ^ uVar170) << 0x28 | uVar153;
  uVar183 = (uVar153 & 0xffffffff) * (uVar159 & 0xffffffff) * 2 + uVar159 + uVar162;
  uVar181 = uVar181 ^ uVar183;
  uVar153 = uVar181 >> 0x10;
  uVar159 = uVar181 << 0x30 | uVar153;
  uVar95 = (uVar72 & 0xffffffff | uVar74) * (uVar95 & 0xffffffff) * 2 + uVar147 + uVar95;
  uVar170 = (uVar153 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + uVar159 + uVar170;
  uVar159 = uVar159 ^ uVar95;
  uVar72 = uVar159 >> 0x20;
  uVar181 = uVar159 << 0x20 | uVar72;
  uVar180 = uVar72 * (uVar180 & 0xffffffff) * 2 + uVar181 + uVar180;
  uVar147 = uVar147 ^ uVar180;
  uVar74 = uVar147 >> 0x18;
  uVar159 = uVar147 << 0x28 | uVar74;
  uVar162 = uVar162 ^ uVar170;
  uVar72 = uVar162 << 1;
  uVar153 = (ulong)((long)uVar162 < 0);
  uVar162 = uVar72 | uVar153;
  uVar95 = (uVar74 & 0xffffffff) * (uVar95 & 0xffffffff) * 2 + uVar159 + uVar95;
  uVar181 = uVar95 ^ uVar181;
  uVar18 = uVar181 >> 0x10;
  uVar135 = uVar181 << 0x30 | uVar18;
  uVar45 = (uVar18 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar135 + uVar180;
  uVar159 = uVar45 ^ uVar159;
  uVar74 = uVar159 << 1;
  uVar147 = (ulong)((long)uVar159 < 0);
  uVar46 = uVar74 | uVar147;
  uVar146 = (uVar73 & 0xffffffff | uVar146) * (uVar190 & 0xffffffff) * 2 + uVar154 + uVar190;
  uVar173 = uVar173 ^ uVar146;
  uVar73 = uVar173 >> 0x20;
  uVar180 = uVar173 << 0x20 | uVar73;
  uVar159 = uVar73 * (uVar170 & 0xffffffff) * 2 + uVar170 + uVar180;
  uVar154 = uVar154 ^ uVar159;
  uVar73 = uVar154 >> 0x18;
  uVar170 = uVar154 << 0x28 | uVar73;
  uVar96 = (uVar73 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar170 + uVar146;
  uVar180 = uVar96 ^ uVar180;
  uVar19 = uVar180 >> 0x10;
  uVar97 = uVar180 << 0x30 | uVar19;
  uVar47 = (uVar19 & 0xffffffff) * (uVar159 & 0xffffffff) * 2 + uVar97 + uVar159;
  uVar170 = uVar47 ^ uVar170;
  uVar73 = uVar170 << 1;
  uVar154 = (ulong)((long)uVar170 < 0);
  uVar48 = uVar73 | uVar154;
  uVar146 = (uVar72 & 0xffffffff | uVar153) * (uVar161 & 0xffffffff) * 2 + uVar162 + uVar161;
  uVar192 = uVar192 ^ uVar146;
  uVar72 = uVar192 >> 0x20;
  uVar170 = uVar192 << 0x20 | uVar72;
  uVar153 = uVar72 * (uVar189 & 0xffffffff) * 2 + uVar170 + uVar189;
  uVar162 = uVar162 ^ uVar153;
  uVar72 = uVar162 >> 0x18;
  uVar159 = uVar162 << 0x28 | uVar72;
  uVar98 = (uVar72 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar159 + uVar146;
  uVar170 = uVar98 ^ uVar170;
  uVar20 = uVar170 >> 0x10;
  uVar99 = uVar170 << 0x30 | uVar20;
  uVar49 = (uVar20 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar99 + uVar153;
  uVar159 = uVar49 ^ uVar159;
  uVar72 = uVar159 << 1;
  uVar162 = (ulong)((long)uVar159 < 0);
  uVar50 = uVar72 | uVar162;
  uVar143 = (uVar69 & 0xffffffff | uVar143) * (uVar183 & 0xffffffff) * 2 + uVar183 + uVar134;
  uVar171 = uVar171 ^ uVar143;
  uVar69 = uVar171 >> 0x20;
  uVar159 = uVar171 << 0x20 | uVar69;
  uVar146 = uVar69 * (uVar160 & 0xffffffff) * 2 + uVar159 + uVar160;
  uVar134 = uVar134 ^ uVar146;
  uVar69 = uVar134 >> 0x18;
  uVar153 = uVar134 << 0x28 | uVar69;
  uVar100 = (uVar69 & 0xffffffff) * (uVar143 & 0xffffffff) * 2 + uVar153 + uVar143;
  uVar159 = uVar100 ^ uVar159;
  uVar21 = uVar159 >> 0x10;
  uVar101 = uVar159 << 0x30 | uVar21;
  uVar51 = (uVar21 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar101 + uVar146;
  uVar153 = uVar51 ^ uVar153;
  uVar69 = uVar153 << 1;
  uVar134 = (ulong)((long)uVar153 < 0);
  uVar52 = uVar69 | uVar134;
  uVar146 = (local_430.v[0x44] & 0xffffffff) * (local_430.v[0x40] & 0xffffffff) * 2 +
            local_430.v[0x44] + local_430.v[0x40];
  uVar143 = (local_430.v[0x4c] ^ uVar146) >> 0x20;
  uVar170 = (local_430.v[0x4c] ^ uVar146) << 0x20 | uVar143;
  uVar153 = uVar143 * (local_430.v[0x48] & 0xffffffff) * 2 + uVar170 + local_430.v[0x48];
  uVar143 = (local_430.v[0x44] ^ uVar153) >> 0x18;
  uVar159 = (local_430.v[0x44] ^ uVar153) << 0x28 | uVar143;
  uVar102 = (uVar143 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar159 + uVar146;
  uVar170 = uVar170 ^ uVar102;
  uVar143 = uVar170 >> 0x10;
  uVar174 = uVar170 << 0x30 | uVar143;
  uVar190 = (uVar143 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar174 + uVar153;
  uVar159 = uVar159 ^ uVar190;
  uVar143 = uVar159 << 1;
  uVar170 = (ulong)((long)uVar159 < 0);
  uVar136 = uVar143 | uVar170;
  uVar153 = (local_430.v[0x45] & 0xffffffff) * (local_430.v[0x41] & 0xffffffff) * 2 +
            local_430.v[0x45] + local_430.v[0x41];
  uVar146 = (local_430.v[0x4d] ^ uVar153) >> 0x20;
  uVar189 = (local_430.v[0x4d] ^ uVar153) << 0x20 | uVar146;
  uVar159 = uVar146 * (local_430.v[0x49] & 0xffffffff) * 2 + uVar189 + local_430.v[0x49];
  uVar146 = (local_430.v[0x45] ^ uVar159) >> 0x18;
  uVar180 = (local_430.v[0x45] ^ uVar159) << 0x28 | uVar146;
  uVar183 = (uVar146 & 0xffffffff) * (uVar153 & 0xffffffff) * 2 + uVar180 + uVar153;
  uVar189 = uVar189 ^ uVar183;
  uVar146 = uVar189 >> 0x10;
  uVar193 = uVar189 << 0x30 | uVar146;
  uVar161 = (uVar146 & 0xffffffff) * (uVar159 & 0xffffffff) * 2 + uVar193 + uVar159;
  uVar180 = uVar180 ^ uVar161;
  uVar146 = uVar180 << 1;
  uVar159 = (ulong)((long)uVar180 < 0);
  uVar148 = uVar146 | uVar159;
  uVar180 = (local_430.v[0x46] & 0xffffffff) * (local_430.v[0x42] & 0xffffffff) * 2 +
            local_430.v[0x46] + local_430.v[0x42];
  uVar153 = (local_430.v[0x4e] ^ uVar180) >> 0x20;
  uVar160 = (local_430.v[0x4e] ^ uVar180) << 0x20 | uVar153;
  uVar189 = uVar153 * (local_430.v[0x4a] & 0xffffffff) * 2 + uVar160 + local_430.v[0x4a];
  uVar153 = (local_430.v[0x46] ^ uVar189) >> 0x18;
  uVar171 = (local_430.v[0x46] ^ uVar189) << 0x28 | uVar153;
  uVar192 = (uVar153 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar171 + uVar180;
  uVar160 = uVar160 ^ uVar192;
  uVar153 = uVar160 >> 0x10;
  uVar67 = uVar160 << 0x30 | uVar153;
  uVar181 = (uVar153 & 0xffffffff) * (uVar189 & 0xffffffff) * 2 + uVar67 + uVar189;
  uVar171 = uVar171 ^ uVar181;
  uVar153 = uVar171 << 1;
  uVar180 = (ulong)((long)uVar171 < 0);
  uVar155 = uVar153 | uVar180;
  uVar160 = (local_430.v[0x47] & 0xffffffff) * (local_430.v[0x43] & 0xffffffff) * 2 +
            local_430.v[0x43] + local_430.v[0x47];
  uVar189 = (local_430.v[0x4f] ^ uVar160) >> 0x20;
  uVar173 = (local_430.v[0x4f] ^ uVar160) << 0x20 | uVar189;
  uVar171 = uVar189 * (local_430.v[0x4b] & 0xffffffff) * 2 + local_430.v[0x4b] + uVar173;
  uVar189 = (local_430.v[0x47] ^ uVar171) >> 0x18;
  uVar163 = (local_430.v[0x47] ^ uVar171) << 0x28 | uVar189;
  uVar184 = (uVar189 & 0xffffffff) * (uVar160 & 0xffffffff) * 2 + uVar160 + uVar163;
  uVar173 = uVar173 ^ uVar184;
  uVar189 = uVar173 >> 0x10;
  uVar160 = uVar173 << 0x30 | uVar189;
  uVar102 = (uVar146 & 0xffffffff | uVar159) * (uVar102 & 0xffffffff) * 2 + uVar148 + uVar102;
  uVar171 = (uVar189 & 0xffffffff) * (uVar171 & 0xffffffff) * 2 + uVar160 + uVar171;
  uVar160 = uVar160 ^ uVar102;
  uVar146 = uVar160 >> 0x20;
  uVar173 = uVar160 << 0x20 | uVar146;
  uVar181 = uVar146 * (uVar181 & 0xffffffff) * 2 + uVar173 + uVar181;
  uVar148 = uVar148 ^ uVar181;
  uVar159 = uVar148 >> 0x18;
  uVar160 = uVar148 << 0x28 | uVar159;
  uVar163 = uVar163 ^ uVar171;
  uVar146 = uVar163 << 1;
  uVar189 = (ulong)((long)uVar163 < 0);
  uVar148 = uVar146 | uVar189;
  uVar102 = (uVar159 & 0xffffffff) * (uVar102 & 0xffffffff) * 2 + uVar160 + uVar102;
  uVar173 = uVar102 ^ uVar173;
  uVar22 = uVar173 >> 0x10;
  uVar137 = uVar173 << 0x30 | uVar22;
  uVar53 = (uVar22 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar137 + uVar181;
  uVar160 = uVar53 ^ uVar160;
  uVar159 = uVar160 << 1;
  uVar173 = (ulong)((long)uVar160 < 0);
  uVar180 = (uVar153 & 0xffffffff | uVar180) * (uVar183 & 0xffffffff) * 2 + uVar155 + uVar183;
  uVar174 = uVar174 ^ uVar180;
  uVar153 = uVar174 >> 0x20;
  uVar181 = uVar174 << 0x20 | uVar153;
  uVar160 = uVar153 * (uVar171 & 0xffffffff) * 2 + uVar171 + uVar181;
  uVar155 = uVar155 ^ uVar160;
  uVar153 = uVar155 >> 0x18;
  uVar171 = uVar155 << 0x28 | uVar153;
  uVar103 = (uVar153 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar171 + uVar180;
  uVar181 = uVar103 ^ uVar181;
  uVar23 = uVar181 >> 0x10;
  uVar104 = uVar181 << 0x30 | uVar23;
  uVar54 = (uVar23 & 0xffffffff) * (uVar160 & 0xffffffff) * 2 + uVar104 + uVar160;
  uVar171 = uVar54 ^ uVar171;
  uVar153 = uVar171 << 1;
  uVar183 = (ulong)((long)uVar171 < 0);
  uVar180 = (uVar146 & 0xffffffff | uVar189) * (uVar192 & 0xffffffff) * 2 + uVar148 + uVar192;
  uVar193 = uVar193 ^ uVar180;
  uVar146 = uVar193 >> 0x20;
  uVar171 = uVar193 << 0x20 | uVar146;
  uVar189 = uVar146 * (uVar190 & 0xffffffff) * 2 + uVar171 + uVar190;
  uVar148 = uVar148 ^ uVar189;
  uVar146 = uVar148 >> 0x18;
  uVar160 = uVar148 << 0x28 | uVar146;
  uVar105 = (uVar146 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar160 + uVar180;
  uVar171 = uVar105 ^ uVar171;
  uVar24 = uVar171 >> 0x10;
  uVar106 = uVar171 << 0x30 | uVar24;
  uVar55 = (uVar24 & 0xffffffff) * (uVar189 & 0xffffffff) * 2 + uVar106 + uVar189;
  uVar160 = uVar55 ^ uVar160;
  uVar146 = uVar160 << 1;
  uVar192 = (ulong)((long)uVar160 < 0);
  uVar170 = (uVar143 & 0xffffffff | uVar170) * (uVar184 & 0xffffffff) * 2 + uVar184 + uVar136;
  uVar67 = uVar67 ^ uVar170;
  uVar143 = uVar67 >> 0x20;
  uVar160 = uVar67 << 0x20 | uVar143;
  uVar180 = uVar143 * (uVar161 & 0xffffffff) * 2 + uVar160 + uVar161;
  uVar136 = uVar136 ^ uVar180;
  uVar143 = uVar136 >> 0x18;
  uVar189 = uVar136 << 0x28 | uVar143;
  uVar107 = (uVar143 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + uVar189 + uVar170;
  uVar160 = uVar107 ^ uVar160;
  uVar25 = uVar160 >> 0x10;
  uVar108 = uVar160 << 0x30 | uVar25;
  uVar56 = (uVar25 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar108 + uVar180;
  uVar189 = uVar56 ^ uVar189;
  uVar143 = uVar189 << 1;
  uVar67 = (ulong)((long)uVar189 < 0);
  uVar180 = (local_430.v[0x54] & 0xffffffff) * (local_430.v[0x50] & 0xffffffff) * 2 +
            local_430.v[0x54] + local_430.v[0x50];
  uVar170 = (local_430.v[0x5c] ^ uVar180) >> 0x20;
  uVar171 = (local_430.v[0x5c] ^ uVar180) << 0x20 | uVar170;
  uVar189 = uVar170 * (local_430.v[0x58] & 0xffffffff) * 2 + uVar171 + local_430.v[0x58];
  uVar170 = (local_430.v[0x54] ^ uVar189) >> 0x18;
  uVar160 = (local_430.v[0x54] ^ uVar189) << 0x28 | uVar170;
  uVar109 = (uVar170 & 0xffffffff) * (uVar180 & 0xffffffff) * 2 + uVar160 + uVar180;
  uVar171 = uVar171 ^ uVar109;
  uVar170 = uVar171 >> 0x10;
  uVar175 = uVar171 << 0x30 | uVar170;
  uVar155 = (uVar170 & 0xffffffff) * (uVar189 & 0xffffffff) * 2 + uVar175 + uVar189;
  uVar160 = uVar160 ^ uVar155;
  uVar170 = uVar160 << 1;
  uVar171 = (ulong)((long)uVar160 < 0);
  uVar138 = uVar170 | uVar171;
  uVar189 = (local_430.v[0x55] & 0xffffffff) * (local_430.v[0x51] & 0xffffffff) * 2 +
            local_430.v[0x55] + local_430.v[0x51];
  uVar180 = (local_430.v[0x5d] ^ uVar189) >> 0x20;
  uVar190 = (local_430.v[0x5d] ^ uVar189) << 0x20 | uVar180;
  uVar160 = uVar180 * (local_430.v[0x59] & 0xffffffff) * 2 + uVar190 + local_430.v[0x59];
  uVar180 = (local_430.v[0x55] ^ uVar160) >> 0x18;
  uVar181 = (local_430.v[0x55] ^ uVar160) << 0x28 | uVar180;
  uVar193 = (uVar180 & 0xffffffff) * (uVar189 & 0xffffffff) * 2 + uVar181 + uVar189;
  uVar190 = uVar190 ^ uVar193;
  uVar180 = uVar190 >> 0x10;
  uVar194 = uVar190 << 0x30 | uVar180;
  uVar163 = (uVar180 & 0xffffffff) * (uVar160 & 0xffffffff) * 2 + uVar194 + uVar160;
  uVar181 = uVar181 ^ uVar163;
  uVar180 = uVar181 << 1;
  uVar160 = (ulong)((long)uVar181 < 0);
  uVar149 = uVar180 | uVar160;
  uVar181 = (local_430.v[0x56] & 0xffffffff) * (local_430.v[0x52] & 0xffffffff) * 2 +
            local_430.v[0x56] + local_430.v[0x52];
  uVar189 = (local_430.v[0x5e] ^ uVar181) >> 0x20;
  uVar161 = (local_430.v[0x5e] ^ uVar181) << 0x20 | uVar189;
  uVar190 = uVar189 * (local_430.v[0x5a] & 0xffffffff) * 2 + uVar161 + local_430.v[0x5a];
  uVar189 = (local_430.v[0x56] ^ uVar190) >> 0x18;
  uVar148 = (local_430.v[0x56] ^ uVar190) << 0x28 | uVar189;
  uVar110 = (uVar189 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar148 + uVar181;
  uVar161 = uVar161 ^ uVar110;
  uVar189 = uVar161 >> 0x10;
  uVar174 = uVar161 << 0x30 | uVar189;
  uVar136 = (uVar189 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar174 + uVar190;
  uVar148 = uVar148 ^ uVar136;
  uVar189 = uVar148 << 1;
  uVar181 = (ulong)((long)uVar148 < 0);
  uVar156 = uVar189 | uVar181;
  uVar161 = (local_430.v[0x57] & 0xffffffff) * (local_430.v[0x53] & 0xffffffff) * 2 +
            local_430.v[0x53] + local_430.v[0x57];
  uVar190 = (local_430.v[0x5f] ^ uVar161) >> 0x20;
  uVar184 = (local_430.v[0x5f] ^ uVar161) << 0x20 | uVar190;
  uVar148 = uVar190 * (local_430.v[0x5b] & 0xffffffff) * 2 + local_430.v[0x5b] + uVar184;
  uVar190 = (local_430.v[0x57] ^ uVar148) >> 0x18;
  uVar164 = (local_430.v[0x57] ^ uVar148) << 0x28 | uVar190;
  uVar185 = (uVar190 & 0xffffffff) * (uVar161 & 0xffffffff) * 2 + uVar161 + uVar164;
  uVar184 = uVar184 ^ uVar185;
  uVar190 = uVar184 >> 0x10;
  uVar161 = uVar184 << 0x30 | uVar190;
  uVar109 = (uVar180 & 0xffffffff | uVar160) * (uVar109 & 0xffffffff) * 2 + uVar149 + uVar109;
  uVar148 = (uVar190 & 0xffffffff) * (uVar148 & 0xffffffff) * 2 + uVar161 + uVar148;
  uVar161 = uVar161 ^ uVar109;
  uVar180 = uVar161 >> 0x20;
  uVar184 = uVar161 << 0x20 | uVar180;
  uVar136 = uVar180 * (uVar136 & 0xffffffff) * 2 + uVar184 + uVar136;
  uVar149 = uVar149 ^ uVar136;
  uVar160 = uVar149 >> 0x18;
  uVar161 = uVar149 << 0x28 | uVar160;
  uVar164 = uVar164 ^ uVar148;
  uVar180 = uVar164 << 1;
  uVar190 = (ulong)((long)uVar164 < 0);
  uVar164 = uVar180 | uVar190;
  uVar109 = (uVar160 & 0xffffffff) * (uVar109 & 0xffffffff) * 2 + uVar161 + uVar109;
  uVar184 = uVar109 ^ uVar184;
  uVar149 = uVar184 >> 0x10;
  uVar139 = uVar184 << 0x30 | uVar149;
  uVar57 = (uVar149 & 0xffffffff) * (uVar136 & 0xffffffff) * 2 + uVar139 + uVar136;
  uVar161 = uVar57 ^ uVar161;
  uVar160 = uVar161 << 1;
  uVar136 = (ulong)((long)uVar161 < 0);
  uVar181 = (uVar189 & 0xffffffff | uVar181) * (uVar193 & 0xffffffff) * 2 + uVar156 + uVar193;
  uVar175 = uVar175 ^ uVar181;
  uVar189 = uVar175 >> 0x20;
  uVar184 = uVar175 << 0x20 | uVar189;
  uVar161 = uVar189 * (uVar148 & 0xffffffff) * 2 + uVar148 + uVar184;
  uVar156 = uVar156 ^ uVar161;
  uVar189 = uVar156 >> 0x18;
  uVar148 = uVar156 << 0x28 | uVar189;
  uVar111 = (uVar189 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar148 + uVar181;
  uVar184 = uVar111 ^ uVar184;
  uVar156 = uVar184 >> 0x10;
  uVar112 = uVar184 << 0x30 | uVar156;
  uVar58 = (uVar156 & 0xffffffff) * (uVar161 & 0xffffffff) * 2 + uVar112 + uVar161;
  uVar148 = uVar58 ^ uVar148;
  uVar189 = uVar148 << 1;
  uVar148 = (ulong)((long)uVar148 < 0);
  uVar181 = (uVar180 & 0xffffffff | uVar190) * (uVar110 & 0xffffffff) * 2 + uVar164 + uVar110;
  uVar194 = uVar194 ^ uVar181;
  uVar180 = uVar194 >> 0x20;
  uVar184 = uVar194 << 0x20 | uVar180;
  uVar190 = uVar180 * (uVar155 & 0xffffffff) * 2 + uVar184 + uVar155;
  uVar164 = uVar164 ^ uVar190;
  uVar180 = uVar164 >> 0x18;
  uVar161 = uVar164 << 0x28 | uVar180;
  uVar113 = (uVar180 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar161 + uVar181;
  uVar184 = uVar113 ^ uVar184;
  uVar164 = uVar184 >> 0x10;
  uVar114 = uVar184 << 0x30 | uVar164;
  uVar59 = (uVar164 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar114 + uVar190;
  uVar161 = uVar59 ^ uVar161;
  uVar180 = uVar161 << 1;
  uVar155 = (ulong)((long)uVar161 < 0);
  uVar171 = (uVar170 & 0xffffffff | uVar171) * (uVar185 & 0xffffffff) * 2 + uVar185 + uVar138;
  uVar174 = uVar174 ^ uVar171;
  uVar170 = uVar174 >> 0x20;
  uVar161 = uVar174 << 0x20 | uVar170;
  uVar181 = uVar170 * (uVar163 & 0xffffffff) * 2 + uVar161 + uVar163;
  uVar138 = uVar138 ^ uVar181;
  uVar170 = uVar138 >> 0x18;
  uVar190 = uVar138 << 0x28 | uVar170;
  uVar115 = (uVar170 & 0xffffffff) * (uVar171 & 0xffffffff) * 2 + uVar190 + uVar171;
  uVar161 = uVar115 ^ uVar161;
  uVar138 = uVar161 >> 0x10;
  uVar116 = uVar161 << 0x30 | uVar138;
  uVar60 = (uVar138 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar116 + uVar181;
  uVar190 = uVar60 ^ uVar190;
  uVar170 = uVar190 << 1;
  uVar163 = (ulong)((long)uVar190 < 0);
  uVar181 = (local_430.v[100] & 0xffffffff) * (local_430.v[0x60] & 0xffffffff) * 2 +
            local_430.v[100] + local_430.v[0x60];
  uVar171 = (local_430.v[0x6c] ^ uVar181) >> 0x20;
  uVar161 = (local_430.v[0x6c] ^ uVar181) << 0x20 | uVar171;
  uVar190 = uVar171 * (local_430.v[0x68] & 0xffffffff) * 2 + uVar161 + local_430.v[0x68];
  uVar171 = (local_430.v[100] ^ uVar190) >> 0x18;
  uVar174 = (local_430.v[100] ^ uVar190) << 0x28 | uVar171;
  uVar110 = (uVar171 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar174 + uVar181;
  uVar161 = uVar161 ^ uVar110;
  uVar171 = uVar161 >> 0x10;
  uVar144 = uVar161 << 0x30 | uVar171;
  uVar61 = (uVar171 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar144 + uVar190;
  uVar174 = uVar174 ^ uVar61;
  uVar171 = uVar174 << 1;
  uVar161 = (ulong)((long)uVar174 < 0);
  uVar176 = uVar171 | uVar161;
  uVar190 = (local_430.v[0x65] & 0xffffffff) * (local_430.v[0x61] & 0xffffffff) * 2 +
            local_430.v[0x65] + local_430.v[0x61];
  uVar181 = (local_430.v[0x6d] ^ uVar190) >> 0x20;
  uVar193 = (local_430.v[0x6d] ^ uVar190) << 0x20 | uVar181;
  uVar174 = uVar181 * (local_430.v[0x69] & 0xffffffff) * 2 + uVar193 + local_430.v[0x69];
  uVar181 = (local_430.v[0x65] ^ uVar174) >> 0x18;
  uVar184 = (local_430.v[0x65] ^ uVar174) << 0x28 | uVar181;
  uVar175 = (uVar181 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar184 + uVar190;
  uVar193 = uVar193 ^ uVar175;
  uVar181 = uVar193 >> 0x10;
  uVar157 = uVar193 << 0x30 | uVar181;
  uVar185 = (uVar181 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar157 + uVar174;
  uVar184 = uVar184 ^ uVar185;
  uVar181 = uVar184 << 1;
  uVar174 = (ulong)((long)uVar184 < 0);
  uVar117 = uVar181 | uVar174;
  uVar184 = (local_430.v[0x66] & 0xffffffff) * (local_430.v[0x62] & 0xffffffff) * 2 +
            local_430.v[0x66] + local_430.v[0x62];
  uVar190 = (local_430.v[0x6e] ^ uVar184) >> 0x20;
  uVar150 = (local_430.v[0x6e] ^ uVar184) << 0x20 | uVar190;
  uVar193 = uVar190 * (local_430.v[0x6a] & 0xffffffff) * 2 + uVar150 + local_430.v[0x6a];
  uVar190 = (local_430.v[0x66] ^ uVar193) >> 0x18;
  uVar165 = (local_430.v[0x66] ^ uVar193) << 0x28 | uVar190;
  uVar194 = (uVar190 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar165 + uVar184;
  uVar150 = uVar150 ^ uVar194;
  uVar190 = uVar150 >> 0x10;
  uVar151 = uVar150 << 0x30 | uVar190;
  uVar62 = (uVar190 & 0xffffffff) * (uVar193 & 0xffffffff) * 2 + uVar151 + uVar193;
  uVar165 = uVar165 ^ uVar62;
  uVar190 = uVar165 << 1;
  uVar184 = (ulong)((long)uVar165 < 0);
  uVar166 = uVar190 | uVar184;
  uVar165 = (local_430.v[0x67] & 0xffffffff) * (local_430.v[99] & 0xffffffff) * 2 +
            local_430.v[99] + local_430.v[0x67];
  uVar193 = (local_430.v[0x6f] ^ uVar165) >> 0x20;
  uVar150 = (local_430.v[0x6f] ^ uVar165) << 0x20 | uVar193;
  local_430.v[0x6b] = uVar193 * (local_430.v[0x6b] & 0xffffffff) * 2 + uVar150 + local_430.v[0x6b];
  uVar193 = (local_430.v[0x67] ^ local_430.v[0x6b]) >> 0x18;
  uVar195 = (local_430.v[0x67] ^ local_430.v[0x6b]) << 0x28 | uVar193;
  uVar165 = (uVar193 & 0xffffffff) * (uVar165 & 0xffffffff) * 2 + uVar195 + uVar165;
  uVar150 = uVar150 ^ uVar165;
  uVar193 = uVar150 >> 0x10;
  uVar150 = uVar150 << 0x30 | uVar193;
  uVar140 = (uVar193 & 0xffffffff) * (local_430.v[0x6b] & 0xffffffff) * 2 +
            local_430.v[0x6b] + uVar150;
  uVar110 = (uVar181 & 0xffffffff | uVar174) * (uVar110 & 0xffffffff) * 2 + uVar117 + uVar110;
  uVar150 = uVar150 ^ uVar110;
  uVar181 = uVar150 >> 0x20;
  uVar150 = uVar150 << 0x20 | uVar181;
  uVar62 = uVar181 * (uVar62 & 0xffffffff) * 2 + uVar150 + uVar62;
  uVar117 = uVar117 ^ uVar62;
  uVar193 = uVar117 >> 0x18;
  uVar118 = uVar117 << 0x28 | uVar193;
  uVar195 = uVar195 ^ uVar140;
  uVar181 = uVar195 << 1;
  uVar174 = (ulong)((long)uVar195 < 0);
  uVar117 = uVar181 | uVar174;
  uVar63 = (uVar193 & 0xffffffff) * (uVar110 & 0xffffffff) * 2 + uVar110 + uVar118;
  uVar150 = uVar150 ^ uVar63;
  uVar193 = uVar150 >> 0x10;
  uVar70 = uVar150 << 0x30 | uVar193;
  uVar62 = (uVar193 & 0xffffffff) * (uVar62 & 0xffffffff) * 2 + uVar70 + uVar62;
  uVar118 = uVar62 ^ uVar118;
  uVar175 = (uVar190 & 0xffffffff | uVar184) * (uVar175 & 0xffffffff) * 2 + uVar166 + uVar175;
  uVar144 = uVar144 ^ uVar175;
  uVar190 = uVar144 >> 0x20;
  uVar193 = uVar144 << 0x20 | uVar190;
  uVar184 = uVar190 * (uVar140 & 0xffffffff) * 2 + uVar140 + uVar193;
  uVar166 = uVar166 ^ uVar184;
  uVar190 = uVar166 >> 0x18;
  uVar167 = uVar166 << 0x28 | uVar190;
  uVar119 = (uVar190 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar175 + uVar167;
  uVar193 = uVar193 ^ uVar119;
  uVar190 = uVar193 >> 0x10;
  uVar195 = uVar193 << 0x30 | uVar190;
  uVar166 = (uVar190 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar195 + uVar184;
  uVar167 = uVar166 ^ uVar167;
  uVar190 = (uVar181 & 0xffffffff | uVar174) * (uVar194 & 0xffffffff) * 2 + uVar117 + uVar194;
  uVar157 = uVar157 ^ uVar190;
  uVar181 = uVar157 >> 0x20;
  uVar184 = uVar157 << 0x20 | uVar181;
  uVar174 = uVar181 * (uVar61 & 0xffffffff) * 2 + uVar184 + uVar61;
  uVar117 = uVar117 ^ uVar174;
  uVar181 = uVar117 >> 0x18;
  uVar196 = uVar117 << 0x28 | uVar181;
  uVar150 = (uVar181 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar196 + uVar190;
  uVar184 = uVar150 ^ uVar184;
  uVar181 = uVar184 >> 0x10;
  uVar120 = uVar184 << 0x30 | uVar181;
  uVar140 = (uVar181 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar120 + uVar174;
  uVar196 = uVar140 ^ uVar196;
  uVar181 = (uVar171 & 0xffffffff | uVar161) * (uVar165 & 0xffffffff) * 2 + uVar165 + uVar176;
  uVar151 = uVar151 ^ uVar181;
  uVar171 = uVar151 >> 0x20;
  uVar161 = uVar151 << 0x20 | uVar171;
  uVar190 = uVar171 * (uVar185 & 0xffffffff) * 2 + uVar161 + uVar185;
  uVar176 = uVar176 ^ uVar190;
  uVar171 = uVar176 >> 0x18;
  uVar177 = uVar176 << 0x28 | uVar171;
  uVar117 = (uVar171 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar177 + uVar181;
  uVar161 = uVar117 ^ uVar161;
  uVar171 = uVar161 >> 0x10;
  uVar121 = uVar161 << 0x30 | uVar171;
  uVar144 = (uVar171 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar121 + uVar190;
  uVar177 = uVar144 ^ uVar177;
  uVar181 = (local_430.v[0x74] & 0xffffffff) * (local_430.v[0x70] & 0xffffffff) * 2 +
            local_430.v[0x70] + local_430.v[0x74];
  uVar171 = (local_430.v[0x7c] ^ uVar181) >> 0x20;
  uVar174 = (local_430.v[0x7c] ^ uVar181) << 0x20 | uVar171;
  uVar190 = uVar171 * (local_430.v[0x78] & 0xffffffff) * 2 + uVar174 + local_430.v[0x78];
  uVar171 = (local_430.v[0x74] ^ uVar190) >> 0x18;
  uVar161 = (local_430.v[0x74] ^ uVar190) << 0x28 | uVar171;
  uVar175 = (uVar171 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar181 + uVar161;
  uVar174 = uVar174 ^ uVar175;
  uVar171 = uVar174 >> 0x10;
  uVar176 = uVar174 << 0x30 | uVar171;
  uVar165 = (uVar171 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar176 + uVar190;
  uVar161 = uVar161 ^ uVar165;
  uVar171 = uVar161 << 1;
  uVar161 = (ulong)((long)uVar161 < 0);
  uVar71 = uVar171 | uVar161;
  uVar190 = (local_430.v[0x75] & 0xffffffff) * (local_430.v[0x71] & 0xffffffff) * 2 +
            local_430.v[0x75] + local_430.v[0x71];
  uVar181 = (local_430.v[0x7d] ^ uVar190) >> 0x20;
  uVar193 = (local_430.v[0x7d] ^ uVar190) << 0x20 | uVar181;
  uVar174 = uVar181 * (local_430.v[0x79] & 0xffffffff) * 2 + uVar193 + local_430.v[0x79];
  uVar181 = (local_430.v[0x75] ^ uVar174) >> 0x18;
  uVar184 = (local_430.v[0x75] ^ uVar174) << 0x28 | uVar181;
  uVar194 = (uVar181 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar184 + uVar190;
  uVar193 = uVar193 ^ uVar194;
  uVar181 = uVar193 >> 0x10;
  uVar168 = uVar193 << 0x30 | uVar181;
  uVar64 = (uVar181 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar168 + uVar174;
  uVar184 = uVar184 ^ uVar64;
  uVar181 = uVar184 << 1;
  uVar174 = (ulong)((long)uVar184 < 0);
  uVar157 = uVar181 | uVar174;
  uVar184 = (local_430.v[0x76] & 0xffffffff) * (local_430.v[0x72] & 0xffffffff) * 2 +
            local_430.v[0x76] + local_430.v[0x72];
  uVar190 = (local_430.v[0x7e] ^ uVar184) >> 0x20;
  uVar193 = (local_430.v[0x7e] ^ uVar184) << 0x20 | uVar190;
  uVar61 = uVar190 * (local_430.v[0x7a] & 0xffffffff) * 2 + local_430.v[0x7a] + uVar193;
  uVar190 = (local_430.v[0x76] ^ uVar61) >> 0x18;
  uVar110 = (local_430.v[0x76] ^ uVar61) << 0x28 | uVar190;
  uVar122 = (uVar190 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar184 + uVar110;
  uVar193 = uVar193 ^ uVar122;
  uVar190 = uVar193 >> 0x10;
  uVar158 = uVar193 << 0x30 | uVar190;
  uVar61 = (uVar190 & 0xffffffff) * (uVar61 & 0xffffffff) * 2 + uVar158 + uVar61;
  uVar110 = uVar110 ^ uVar61;
  uVar190 = uVar110 << 1;
  uVar184 = (ulong)((long)uVar110 < 0);
  uVar178 = uVar190 | uVar184;
  uVar185 = (local_430.v[0x77] & 0xffffffff) * (local_430.v[0x73] & 0xffffffff) * 2 +
            local_430.v[0x73] + local_430.v[0x77];
  uVar193 = (local_430.v[0x7f] ^ uVar185) >> 0x20;
  uVar110 = (local_430.v[0x7f] ^ uVar185) << 0x20 | uVar193;
  local_430.v[0x7b] = uVar193 * (local_430.v[0x7b] & 0xffffffff) * 2 + uVar110 + local_430.v[0x7b];
  uVar193 = (local_430.v[0x77] ^ local_430.v[0x7b]) >> 0x18;
  uVar186 = (local_430.v[0x77] ^ local_430.v[0x7b]) << 0x28 | uVar193;
  uVar68 = (uVar193 & 0xffffffff) * (uVar185 & 0xffffffff) * 2 + uVar185 + uVar186;
  uVar110 = uVar110 ^ uVar68;
  uVar193 = uVar110 >> 0x10;
  uVar110 = uVar110 << 0x30 | uVar193;
  uVar151 = (uVar193 & 0xffffffff) * (local_430.v[0x7b] & 0xffffffff) * 2 +
            local_430.v[0x7b] + uVar110;
  uVar175 = (uVar181 & 0xffffffff | uVar174) * (uVar175 & 0xffffffff) * 2 + uVar157 + uVar175;
  uVar110 = uVar110 ^ uVar175;
  uVar181 = uVar110 >> 0x20;
  uVar110 = uVar110 << 0x20 | uVar181;
  uVar61 = uVar181 * (uVar61 & 0xffffffff) * 2 + uVar110 + uVar61;
  uVar157 = uVar157 ^ uVar61;
  uVar193 = uVar157 >> 0x18;
  uVar185 = uVar157 << 0x28 | uVar193;
  uVar186 = uVar186 ^ uVar151;
  uVar181 = uVar186 << 1;
  uVar174 = (ulong)((long)uVar186 < 0);
  uVar187 = uVar181 | uVar174;
  uVar123 = (uVar193 & 0xffffffff) * (uVar175 & 0xffffffff) * 2 + uVar175 + uVar185;
  uVar110 = uVar110 ^ uVar123;
  uVar193 = uVar110 >> 0x10;
  uVar175 = uVar110 << 0x30 | uVar193;
  uVar157 = (uVar193 & 0xffffffff) * (uVar61 & 0xffffffff) * 2 + uVar175 + uVar61;
  uVar185 = uVar157 ^ uVar185;
  uVar194 = (uVar190 & 0xffffffff | uVar184) * (uVar194 & 0xffffffff) * 2 + uVar178 + uVar194;
  uVar176 = uVar176 ^ uVar194;
  uVar190 = uVar176 >> 0x20;
  uVar193 = uVar176 << 0x20 | uVar190;
  uVar184 = uVar190 * (uVar151 & 0xffffffff) * 2 + uVar151 + uVar193;
  uVar178 = uVar178 ^ uVar184;
  uVar190 = uVar178 >> 0x18;
  uVar186 = uVar178 << 0x28 | uVar190;
  uVar141 = (uVar190 & 0xffffffff) * (uVar194 & 0xffffffff) * 2 + uVar194 + uVar186;
  uVar193 = uVar193 ^ uVar141;
  uVar190 = uVar193 >> 0x10;
  uVar176 = uVar193 << 0x30 | uVar190;
  uVar178 = (uVar190 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar176 + uVar184;
  uVar186 = uVar178 ^ uVar186;
  uVar190 = (uVar181 & 0xffffffff | uVar174) * (uVar122 & 0xffffffff) * 2 + uVar122 + uVar187;
  uVar168 = uVar168 ^ uVar190;
  uVar181 = uVar168 >> 0x20;
  uVar184 = uVar168 << 0x20 | uVar181;
  uVar174 = uVar181 * (uVar165 & 0xffffffff) * 2 + uVar184 + uVar165;
  uVar187 = uVar187 ^ uVar174;
  uVar181 = uVar187 >> 0x18;
  uVar168 = uVar187 << 0x28 | uVar181;
  uVar165 = (uVar181 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar190 + uVar168;
  uVar184 = uVar165 ^ uVar184;
  uVar181 = uVar184 >> 0x10;
  uVar122 = uVar184 << 0x30 | uVar181;
  uVar151 = (uVar181 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar122 + uVar174;
  uVar168 = uVar151 ^ uVar168;
  uVar181 = (uVar171 & 0xffffffff | uVar161) * (uVar68 & 0xffffffff) * 2 + uVar68 + uVar71;
  uVar158 = uVar158 ^ uVar181;
  uVar171 = uVar158 >> 0x20;
  uVar161 = uVar158 << 0x20 | uVar171;
  uVar190 = uVar171 * (uVar64 & 0xffffffff) * 2 + uVar161 + uVar64;
  uVar71 = uVar71 ^ uVar190;
  uVar171 = uVar71 >> 0x18;
  uVar158 = uVar71 << 0x28 | uVar171;
  uVar68 = (uVar171 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar181 + uVar158;
  uVar161 = uVar68 ^ uVar161;
  uVar171 = uVar161 >> 0x10;
  uVar64 = uVar161 << 0x30 | uVar171;
  uVar71 = (uVar171 & 0xffffffff) * (uVar190 & 0xffffffff) * 2 + uVar64 + uVar190;
  uVar158 = uVar71 ^ uVar158;
  uVar181 = (uVar88 & 0xffffffff) * (uVar129 & 0xffffffff) * 2 + uVar88 + uVar129;
  uVar63 = uVar63 ^ uVar181;
  uVar171 = uVar63 >> 0x20;
  uVar174 = uVar63 << 0x20 | uVar171;
  uVar161 = uVar171 * (uVar102 & 0xffffffff) * 2 + uVar174 + uVar102;
  uVar171 = (uVar88 ^ uVar161) >> 0x18;
  uVar190 = (uVar88 ^ uVar161) << 0x28 | uVar171;
  uVar110 = (uVar171 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar190 + uVar181;
  uVar174 = uVar174 ^ uVar110;
  uVar171 = uVar174 >> 0x10;
  uVar179 = uVar174 << 0x30 | uVar171;
  uVar187 = (uVar171 & 0xffffffff) * (uVar161 & 0xffffffff) * 2 + uVar179 + uVar161;
  uVar190 = uVar187 ^ uVar190;
  uVar171 = uVar190 << 1;
  uVar161 = (ulong)((long)uVar190 < 0);
  uVar88 = uVar171 | uVar161;
  uVar174 = (uVar89 & 0xffffffff) * (uVar75 & 0xffffffff) * 2 + uVar89 + uVar75;
  uVar119 = uVar119 ^ uVar174;
  uVar181 = uVar119 >> 0x20;
  uVar193 = uVar119 << 0x20 | uVar181;
  uVar184 = uVar181 * (uVar103 & 0xffffffff) * 2 + uVar193 + uVar103;
  uVar181 = (uVar89 ^ uVar184) >> 0x18;
  uVar190 = (uVar89 ^ uVar184) << 0x28 | uVar181;
  uVar102 = (uVar181 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar190 + uVar174;
  uVar193 = uVar193 ^ uVar102;
  uVar181 = uVar193 >> 0x10;
  uVar194 = uVar193 << 0x30 | uVar181;
  uVar63 = (uVar181 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar194 + uVar184;
  uVar190 = uVar63 ^ uVar190;
  uVar181 = uVar190 << 1;
  uVar174 = (ulong)((long)uVar190 < 0);
  uVar75 = uVar181 | uVar174;
  uVar61 = (uVar95 & 0xffffffff) * (uVar81 & 0xffffffff) * 2 + uVar95 + uVar81;
  uVar123 = uVar123 ^ uVar61;
  uVar190 = uVar123 >> 0x20;
  uVar193 = uVar123 << 0x20 | uVar190;
  uVar129 = uVar190 * (uVar109 & 0xffffffff) * 2 + uVar193 + uVar109;
  uVar190 = (uVar95 ^ uVar129) >> 0x18;
  uVar184 = (uVar95 ^ uVar129) << 0x28 | uVar190;
  uVar95 = (uVar190 & 0xffffffff) * (uVar61 & 0xffffffff) * 2 + uVar184 + uVar61;
  uVar193 = uVar95 ^ uVar193;
  uVar190 = uVar193 >> 0x10;
  uVar61 = uVar193 << 0x30 | uVar190;
  uVar89 = (uVar190 & 0xffffffff) * (uVar129 & 0xffffffff) * 2 + uVar61 + uVar129;
  uVar184 = uVar184 ^ uVar89;
  uVar190 = uVar184 << 1;
  uVar184 = (ulong)((long)uVar184 < 0);
  uVar129 = uVar190 | uVar184;
  uVar82 = (uVar96 & 0xffffffff) * (uVar82 & 0xffffffff) * 2 + uVar96 + uVar82;
  uVar141 = uVar141 ^ uVar82;
  uVar193 = uVar141 >> 0x20;
  uVar109 = uVar141 << 0x20 | uVar193;
  uVar103 = uVar193 * (uVar111 & 0xffffffff) * 2 + uVar109 + uVar111;
  uVar193 = (uVar96 ^ uVar103) >> 0x18;
  uVar81 = (uVar96 ^ uVar103) << 0x28 | uVar193;
  uVar82 = (uVar193 & 0xffffffff) * (uVar82 & 0xffffffff) * 2 + uVar81 + uVar82;
  uVar109 = uVar82 ^ uVar109;
  uVar193 = uVar109 >> 0x10;
  uVar109 = uVar109 << 0x30 | uVar193;
  local_430.v[0] = (uVar181 & 0xffffffff | uVar174) * (uVar110 & 0xffffffff) * 2 + uVar110 + uVar75;
  uVar174 = uVar109 ^ local_430.v[0];
  uVar181 = uVar174 >> 0x20;
  uVar96 = uVar174 << 0x20 | uVar181;
  uVar109 = (uVar193 & 0xffffffff) * (uVar103 & 0xffffffff) * 2 + uVar103 + uVar109;
  uVar110 = uVar181 * (uVar89 & 0xffffffff) * 2 + uVar96 + uVar89;
  uVar75 = uVar75 ^ uVar110;
  uVar193 = uVar75 >> 0x18;
  uVar75 = uVar75 << 0x28 | uVar193;
  uVar81 = uVar81 ^ uVar109;
  uVar181 = uVar81 << 1;
  uVar174 = (ulong)((long)uVar81 < 0);
  uVar81 = uVar181 | uVar174;
  local_430.v[0] =
       (uVar193 & 0xffffffff) * (local_430.v[0] & 0xffffffff) * 2 + uVar75 + local_430.v[0];
  uVar96 = local_430.v[0] ^ uVar96;
  uVar193 = uVar96 >> 0x10;
  local_430.v[0x71] = uVar96 << 0x30 | uVar193;
  local_430.v[0x50] =
       (uVar193 & 0xffffffff) * (uVar110 & 0xffffffff) * 2 + local_430.v[0x71] + uVar110;
  uVar75 = local_430.v[0x50] ^ uVar75;
  local_430.v[0x21] = uVar75 << 1 | (ulong)((long)uVar75 < 0);
  uVar184 = (uVar190 & 0xffffffff | uVar184) * (uVar102 & 0xffffffff) * 2 + uVar129 + uVar102;
  uVar179 = uVar179 ^ uVar184;
  uVar190 = uVar179 >> 0x20;
  uVar102 = uVar179 << 0x20 | uVar190;
  uVar110 = uVar190 * (uVar109 & 0xffffffff) * 2 + uVar109 + uVar102;
  uVar129 = uVar129 ^ uVar110;
  uVar190 = uVar129 >> 0x18;
  uVar193 = uVar129 << 0x28 | uVar190;
  local_430.v[1] = (uVar190 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar184 + uVar193;
  uVar102 = local_430.v[1] ^ uVar102;
  uVar190 = uVar102 >> 0x10;
  local_430.v[0x60] = uVar102 << 0x30 | uVar190;
  local_430.v[0x51] =
       (uVar190 & 0xffffffff) * (uVar110 & 0xffffffff) * 2 + local_430.v[0x60] + uVar110;
  uVar193 = local_430.v[0x51] ^ uVar193;
  local_430.v[0x30] = uVar193 << 1 | (ulong)((long)uVar193 < 0);
  uVar184 = (uVar181 & 0xffffffff | uVar174) * (uVar95 & 0xffffffff) * 2 + uVar81 + uVar95;
  uVar194 = uVar194 ^ uVar184;
  uVar181 = uVar194 >> 0x20;
  uVar190 = uVar194 << 0x20 | uVar181;
  uVar193 = uVar181 * (uVar187 & 0xffffffff) * 2 + uVar190 + uVar187;
  uVar81 = uVar81 ^ uVar193;
  uVar181 = uVar81 >> 0x18;
  uVar174 = uVar81 << 0x28 | uVar181;
  local_430.v[0x10] = (uVar181 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar174 + uVar184;
  uVar190 = local_430.v[0x10] ^ uVar190;
  uVar181 = uVar190 >> 0x10;
  local_430.v[0x61] = uVar190 << 0x30 | uVar181;
  local_430.v[0x40] =
       (uVar181 & 0xffffffff) * (uVar193 & 0xffffffff) * 2 + local_430.v[0x61] + uVar193;
  uVar174 = local_430.v[0x40] ^ uVar174;
  local_430.v[0x31] = uVar174 << 1 | (ulong)((long)uVar174 < 0);
  uVar161 = (uVar171 & 0xffffffff | uVar161) * (uVar82 & 0xffffffff) * 2 + uVar88 + uVar82;
  uVar61 = uVar61 ^ uVar161;
  uVar171 = uVar61 >> 0x20;
  uVar181 = uVar61 << 0x20 | uVar171;
  uVar174 = uVar171 * (uVar63 & 0xffffffff) * 2 + uVar181 + uVar63;
  uVar88 = uVar88 ^ uVar174;
  uVar171 = uVar88 >> 0x18;
  uVar190 = uVar88 << 0x28 | uVar171;
  local_430.v[0x11] = (uVar171 & 0xffffffff) * (uVar161 & 0xffffffff) * 2 + uVar190 + uVar161;
  uVar181 = local_430.v[0x11] ^ uVar181;
  uVar171 = uVar181 >> 0x10;
  local_430.v[0x70] = uVar181 << 0x30 | uVar171;
  local_430.v[0x41] =
       (uVar171 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + local_430.v[0x70] + uVar174;
  uVar190 = local_430.v[0x41] ^ uVar190;
  local_430.v[0x20] = uVar190 << 1 | (ulong)((long)uVar190 < 0);
  uVar161 = (uVar91 & 0xffffffff) * (uVar77 & 0xffffffff) * 2 + uVar91 + uVar77;
  uVar150 = uVar150 ^ uVar161;
  uVar171 = uVar150 >> 0x20;
  uVar181 = uVar150 << 0x20 | uVar171;
  uVar174 = uVar171 * (uVar105 & 0xffffffff) * 2 + uVar181 + uVar105;
  uVar171 = (uVar91 ^ uVar174) >> 0x18;
  uVar190 = (uVar91 ^ uVar174) << 0x28 | uVar171;
  uVar77 = (uVar171 & 0xffffffff) * (uVar161 & 0xffffffff) * 2 + uVar190 + uVar161;
  uVar181 = uVar77 ^ uVar181;
  uVar171 = uVar181 >> 0x10;
  uVar150 = uVar181 << 0x30 | uVar171;
  uVar102 = (uVar171 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + uVar150 + uVar174;
  uVar190 = uVar102 ^ uVar190;
  uVar171 = uVar190 << 1;
  uVar174 = (ulong)((long)uVar190 < 0);
  uVar95 = uVar171 | uVar174;
  uVar184 = (uVar93 & 0xffffffff) * (uVar79 & 0xffffffff) * 2 + uVar93 + uVar79;
  uVar117 = uVar117 ^ uVar184;
  uVar181 = uVar117 >> 0x20;
  uVar190 = uVar117 << 0x20 | uVar181;
  uVar193 = uVar181 * (uVar107 & 0xffffffff) * 2 + uVar190 + uVar107;
  uVar181 = (uVar93 ^ uVar193) >> 0x18;
  uVar161 = (uVar93 ^ uVar193) << 0x28 | uVar181;
  uVar79 = (uVar181 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar161 + uVar184;
  uVar190 = uVar79 ^ uVar190;
  uVar181 = uVar190 >> 0x10;
  uVar117 = uVar190 << 0x30 | uVar181;
  uVar109 = (uVar181 & 0xffffffff) * (uVar193 & 0xffffffff) * 2 + uVar117 + uVar193;
  uVar161 = uVar109 ^ uVar161;
  uVar181 = uVar161 << 1;
  uVar184 = (ulong)((long)uVar161 < 0);
  uVar129 = uVar181 | uVar184;
  uVar110 = (uVar98 & 0xffffffff) * (uVar84 & 0xffffffff) * 2 + uVar98 + uVar84;
  uVar165 = uVar165 ^ uVar110;
  uVar190 = uVar165 >> 0x20;
  uVar161 = uVar165 << 0x20 | uVar190;
  uVar194 = uVar190 * (uVar113 & 0xffffffff) * 2 + uVar161 + uVar113;
  uVar190 = (uVar98 ^ uVar194) >> 0x18;
  uVar193 = (uVar98 ^ uVar194) << 0x28 | uVar190;
  uVar82 = (uVar190 & 0xffffffff) * (uVar110 & 0xffffffff) * 2 + uVar193 + uVar110;
  uVar161 = uVar82 ^ uVar161;
  uVar190 = uVar161 >> 0x10;
  uVar165 = uVar161 << 0x30 | uVar190;
  uVar63 = (uVar190 & 0xffffffff) * (uVar194 & 0xffffffff) * 2 + uVar165 + uVar194;
  uVar193 = uVar63 ^ uVar193;
  uVar190 = uVar193 << 1;
  uVar193 = (ulong)((long)uVar193 < 0);
  uVar81 = uVar190 | uVar193;
  uVar110 = (uVar100 & 0xffffffff) * (uVar86 & 0xffffffff) * 2 + uVar100 + uVar86;
  uVar68 = uVar68 ^ uVar110;
  uVar161 = uVar68 >> 0x20;
  uVar61 = uVar68 << 0x20 | uVar161;
  uVar68 = uVar161 * (uVar115 & 0xffffffff) * 2 + uVar61 + uVar115;
  uVar161 = (uVar100 ^ uVar68) >> 0x18;
  uVar88 = (uVar100 ^ uVar68) << 0x28 | uVar161;
  uVar194 = (uVar161 & 0xffffffff) * (uVar110 & 0xffffffff) * 2 + uVar88 + uVar110;
  uVar61 = uVar194 ^ uVar61;
  uVar161 = uVar61 >> 0x10;
  uVar61 = uVar61 << 0x30 | uVar161;
  uVar75 = (uVar161 & 0xffffffff) * (uVar68 & 0xffffffff) * 2 + uVar61 + uVar68;
  uVar88 = uVar75 ^ uVar88;
  uVar161 = uVar88 << 1;
  uVar110 = (ulong)((long)uVar88 < 0);
  uVar88 = uVar161 | uVar110;
  uVar68 = (uVar181 & 0xffffffff | uVar184) * (uVar77 & 0xffffffff) * 2 + uVar129 + uVar77;
  uVar61 = uVar61 ^ uVar68;
  uVar181 = uVar61 >> 0x20;
  uVar184 = uVar61 << 0x20 | uVar181;
  uVar63 = uVar181 * (uVar63 & 0xffffffff) * 2 + uVar184 + uVar63;
  uVar129 = uVar129 ^ uVar63;
  uVar181 = uVar129 >> 0x18;
  uVar61 = uVar129 << 0x28 | uVar181;
  local_430.v[2] = (uVar181 & 0xffffffff) * (uVar68 & 0xffffffff) * 2 + uVar61 + uVar68;
  uVar184 = local_430.v[2] ^ uVar184;
  uVar181 = uVar184 >> 0x10;
  local_430.v[0x73] = uVar184 << 0x30 | uVar181;
  local_430.v[0x52] =
       (uVar181 & 0xffffffff) * (uVar63 & 0xffffffff) * 2 + local_430.v[0x73] + uVar63;
  uVar61 = local_430.v[0x52] ^ uVar61;
  local_430.v[0x23] = uVar61 << 1 | (ulong)((long)uVar61 < 0);
  uVar193 = (uVar190 & 0xffffffff | uVar193) * (uVar79 & 0xffffffff) * 2 + uVar81 + uVar79;
  uVar150 = uVar150 ^ uVar193;
  uVar181 = uVar150 >> 0x20;
  uVar190 = uVar150 << 0x20 | uVar181;
  uVar61 = uVar181 * (uVar75 & 0xffffffff) * 2 + uVar190 + uVar75;
  uVar81 = uVar81 ^ uVar61;
  uVar181 = uVar81 >> 0x18;
  uVar184 = uVar81 << 0x28 | uVar181;
  local_430.v[3] = (uVar181 & 0xffffffff) * (uVar193 & 0xffffffff) * 2 + uVar184 + uVar193;
  uVar190 = local_430.v[3] ^ uVar190;
  uVar181 = uVar190 >> 0x10;
  local_430.v[0x62] = uVar190 << 0x30 | uVar181;
  local_430.v[0x53] =
       (uVar181 & 0xffffffff) * (uVar61 & 0xffffffff) * 2 + local_430.v[0x62] + uVar61;
  uVar184 = local_430.v[0x53] ^ uVar184;
  local_430.v[0x32] = uVar184 << 1 | (ulong)((long)uVar184 < 0);
  uVar184 = (uVar161 & 0xffffffff | uVar110) * (uVar82 & 0xffffffff) * 2 + uVar88 + uVar82;
  uVar117 = uVar117 ^ uVar184;
  uVar181 = uVar117 >> 0x20;
  uVar190 = uVar117 << 0x20 | uVar181;
  uVar193 = uVar181 * (uVar102 & 0xffffffff) * 2 + uVar190 + uVar102;
  uVar88 = uVar88 ^ uVar193;
  uVar181 = uVar88 >> 0x18;
  uVar161 = uVar88 << 0x28 | uVar181;
  local_430.v[0x12] = (uVar181 & 0xffffffff) * (uVar184 & 0xffffffff) * 2 + uVar161 + uVar184;
  uVar190 = local_430.v[0x12] ^ uVar190;
  uVar181 = uVar190 >> 0x10;
  local_430.v[99] = uVar190 << 0x30 | uVar181;
  local_430.v[0x42] =
       (uVar181 & 0xffffffff) * (uVar193 & 0xffffffff) * 2 + local_430.v[99] + uVar193;
  uVar161 = local_430.v[0x42] ^ uVar161;
  local_430.v[0x33] = uVar161 << 1 | (ulong)((long)uVar161 < 0);
  uVar161 = (uVar171 & 0xffffffff | uVar174) * (uVar194 & 0xffffffff) * 2 + uVar95 + uVar194;
  uVar165 = uVar165 ^ uVar161;
  uVar171 = uVar165 >> 0x20;
  uVar181 = uVar165 << 0x20 | uVar171;
  uVar174 = uVar171 * (uVar109 & 0xffffffff) * 2 + uVar181 + uVar109;
  uVar95 = uVar95 ^ uVar174;
  uVar171 = uVar95 >> 0x18;
  uVar190 = uVar95 << 0x28 | uVar171;
  local_430.v[0x13] = (uVar171 & 0xffffffff) * (uVar161 & 0xffffffff) * 2 + uVar190 + uVar161;
  uVar181 = local_430.v[0x13] ^ uVar181;
  uVar171 = uVar181 >> 0x10;
  local_430.v[0x72] = uVar181 << 0x30 | uVar171;
  local_430.v[0x43] =
       (uVar171 & 0xffffffff) * (uVar174 & 0xffffffff) * 2 + local_430.v[0x72] + uVar174;
  uVar190 = local_430.v[0x43] ^ uVar190;
  local_430.v[0x22] = uVar190 << 1 | (ulong)((long)uVar190 < 0);
  uVar171 = (uVar152 & 0xffffffff | uVar182) * (uVar5 & 0xffffffff | uVar124) * 2 +
            uVar44 + (uVar5 | uVar124);
  uVar152 = (uVar177 << 1 | (ulong)((long)uVar177 < 0)) ^ uVar171;
  uVar5 = uVar152 >> 0x20;
  uVar152 = uVar152 << 0x20 | uVar5;
  uVar181 = uVar5 * (uVar143 & 0xffffffff | uVar67) * 2 + uVar152 + (uVar143 | uVar67);
  uVar44 = uVar44 ^ uVar181;
  uVar5 = uVar44 >> 0x18;
  uVar143 = uVar44 << 0x28 | uVar5;
  uVar67 = (uVar5 & 0xffffffff) * (uVar171 & 0xffffffff) * 2 + uVar143 + uVar171;
  uVar152 = uVar67 ^ uVar152;
  uVar5 = uVar152 >> 0x10;
  uVar171 = uVar152 << 0x30 | uVar5;
  uVar182 = (uVar5 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar171 + uVar181;
  uVar143 = uVar182 ^ uVar143;
  uVar5 = uVar143 << 1;
  uVar152 = (ulong)((long)uVar143 < 0);
  uVar124 = uVar5 | uVar152;
  uVar181 = (uVar66 & 0xffffffff | uVar125) * (uVar142 & 0xffffffff | uVar127) * 2 +
            uVar38 + (uVar142 | uVar127);
  uVar66 = (uVar118 << 1 | (ulong)((long)uVar118 < 0)) ^ uVar181;
  uVar142 = uVar66 >> 0x20;
  uVar66 = uVar66 << 0x20 | uVar142;
  uVar159 = uVar142 * (uVar159 & 0xffffffff | uVar173) * 2 + uVar66 + (uVar159 | uVar173);
  uVar38 = uVar38 ^ uVar159;
  uVar142 = uVar38 >> 0x18;
  uVar143 = uVar38 << 0x28 | uVar142;
  uVar173 = (uVar142 & 0xffffffff) * (uVar181 & 0xffffffff) * 2 + uVar143 + uVar181;
  uVar66 = uVar173 ^ uVar66;
  uVar142 = uVar66 >> 0x10;
  uVar181 = uVar66 << 0x30 | uVar142;
  uVar125 = (uVar142 & 0xffffffff) * (uVar159 & 0xffffffff) * 2 + uVar181 + uVar159;
  uVar143 = uVar125 ^ uVar143;
  uVar142 = uVar143 << 1;
  uVar66 = (ulong)((long)uVar143 < 0);
  uVar190 = uVar142 | uVar66;
  uVar159 = (uVar69 & 0xffffffff | uVar134) * (uVar169 & 0xffffffff | uVar126) * 2 +
            uVar52 + (uVar169 | uVar126);
  uVar69 = (uVar158 << 1 | (ulong)((long)uVar158 < 0)) ^ uVar159;
  uVar169 = uVar69 >> 0x20;
  uVar69 = uVar69 << 0x20 | uVar169;
  uVar161 = uVar169 * (uVar170 & 0xffffffff | uVar163) * 2 + uVar69 + (uVar170 | uVar163);
  uVar52 = uVar52 ^ uVar161;
  uVar169 = uVar52 >> 0x18;
  uVar143 = uVar52 << 0x28 | uVar169;
  uVar134 = (uVar169 & 0xffffffff) * (uVar159 & 0xffffffff) * 2 + uVar143 + uVar159;
  uVar69 = uVar134 ^ uVar69;
  uVar169 = uVar69 >> 0x10;
  uVar170 = uVar69 << 0x30 | uVar169;
  uVar126 = (uVar169 & 0xffffffff) * (uVar161 & 0xffffffff) * 2 + uVar170 + uVar161;
  uVar143 = uVar126 ^ uVar143;
  uVar169 = uVar143 << 1;
  uVar69 = (ulong)((long)uVar143 < 0);
  uVar161 = uVar169 | uVar69;
  uVar74 = (uVar74 & 0xffffffff | uVar147) * (uVar65 & 0xffffffff | uVar128) * 2 +
           uVar46 + (uVar65 | uVar128);
  uVar143 = (uVar185 << 1 | (ulong)((long)uVar185 < 0)) ^ uVar74;
  uVar65 = uVar143 >> 0x20;
  uVar159 = uVar143 << 0x20 | uVar65;
  uVar127 = uVar65 * (uVar160 & 0xffffffff | uVar136) * 2 + uVar159 + (uVar160 | uVar136);
  uVar46 = uVar46 ^ uVar127;
  uVar65 = uVar46 >> 0x18;
  uVar160 = uVar46 << 0x28 | uVar65;
  uVar143 = (uVar65 & 0xffffffff) * (uVar74 & 0xffffffff) * 2 + uVar160 + uVar74;
  uVar159 = uVar143 ^ uVar159;
  uVar65 = uVar159 >> 0x10;
  uVar159 = uVar159 << 0x30 | uVar65;
  uVar147 = (uVar65 & 0xffffffff) * (uVar127 & 0xffffffff) * 2 + uVar159 + uVar127;
  uVar160 = uVar147 ^ uVar160;
  uVar65 = uVar160 << 1;
  uVar74 = (ulong)((long)uVar160 < 0);
  uVar160 = uVar65 | uVar74;
  uVar127 = (uVar142 & 0xffffffff | uVar66) * (uVar67 & 0xffffffff) * 2 + uVar190 + uVar67;
  uVar159 = uVar159 ^ uVar127;
  uVar142 = uVar159 >> 0x20;
  uVar66 = uVar159 << 0x20 | uVar142;
  uVar128 = uVar142 * (uVar126 & 0xffffffff) * 2 + uVar66 + uVar126;
  uVar190 = uVar190 ^ uVar128;
  uVar142 = uVar190 >> 0x18;
  uVar159 = uVar190 << 0x28 | uVar142;
  local_430.v[4] = (uVar142 & 0xffffffff) * (uVar127 & 0xffffffff) * 2 + uVar159 + uVar127;
  uVar66 = local_430.v[4] ^ uVar66;
  uVar142 = uVar66 >> 0x10;
  local_430.v[0x75] = uVar66 << 0x30 | uVar142;
  local_430.v[0x54] =
       (uVar142 & 0xffffffff) * (uVar128 & 0xffffffff) * 2 + local_430.v[0x75] + uVar128;
  uVar159 = local_430.v[0x54] ^ uVar159;
  local_430.v[0x25] = uVar159 << 1 | (ulong)((long)uVar159 < 0);
  uVar69 = (uVar169 & 0xffffffff | uVar69) * (uVar173 & 0xffffffff) * 2 + uVar161 + uVar173;
  uVar171 = uVar171 ^ uVar69;
  uVar142 = uVar171 >> 0x20;
  uVar169 = uVar171 << 0x20 | uVar142;
  uVar159 = uVar142 * (uVar147 & 0xffffffff) * 2 + uVar169 + uVar147;
  uVar161 = uVar161 ^ uVar159;
  uVar142 = uVar161 >> 0x18;
  uVar66 = uVar161 << 0x28 | uVar142;
  local_430.v[5] = (uVar142 & 0xffffffff) * (uVar69 & 0xffffffff) * 2 + uVar66 + uVar69;
  uVar169 = local_430.v[5] ^ uVar169;
  uVar142 = uVar169 >> 0x10;
  local_430.v[100] = uVar169 << 0x30 | uVar142;
  local_430.v[0x55] =
       (uVar142 & 0xffffffff) * (uVar159 & 0xffffffff) * 2 + local_430.v[100] + uVar159;
  uVar66 = local_430.v[0x55] ^ uVar66;
  local_430.v[0x34] = uVar66 << 1 | (ulong)((long)uVar66 < 0);
  uVar66 = (uVar65 & 0xffffffff | uVar74) * (uVar134 & 0xffffffff) * 2 + uVar160 + uVar134;
  uVar181 = uVar181 ^ uVar66;
  uVar142 = uVar181 >> 0x20;
  uVar169 = uVar181 << 0x20 | uVar142;
  uVar69 = uVar142 * (uVar182 & 0xffffffff) * 2 + uVar169 + uVar182;
  uVar160 = uVar160 ^ uVar69;
  uVar142 = uVar160 >> 0x18;
  uVar65 = uVar160 << 0x28 | uVar142;
  local_430.v[0x14] = (uVar142 & 0xffffffff) * (uVar66 & 0xffffffff) * 2 + uVar65 + uVar66;
  uVar169 = local_430.v[0x14] ^ uVar169;
  uVar142 = uVar169 >> 0x10;
  local_430.v[0x65] = uVar169 << 0x30 | uVar142;
  local_430.v[0x44] =
       (uVar142 & 0xffffffff) * (uVar69 & 0xffffffff) * 2 + local_430.v[0x65] + uVar69;
  uVar65 = local_430.v[0x44] ^ uVar65;
  local_430.v[0x35] = uVar65 << 1 | (ulong)((long)uVar65 < 0);
  uVar65 = (uVar5 & 0xffffffff | uVar152) * (uVar143 & 0xffffffff) * 2 + uVar124 + uVar143;
  uVar170 = uVar170 ^ uVar65;
  uVar5 = uVar170 >> 0x20;
  uVar142 = uVar170 << 0x20 | uVar5;
  uVar152 = uVar5 * (uVar125 & 0xffffffff) * 2 + uVar142 + uVar125;
  uVar124 = uVar124 ^ uVar152;
  uVar5 = uVar124 >> 0x18;
  uVar169 = uVar124 << 0x28 | uVar5;
  local_430.v[0x15] = (uVar5 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar169 + uVar65;
  uVar142 = local_430.v[0x15] ^ uVar142;
  uVar5 = uVar142 >> 0x10;
  local_430.v[0x74] = uVar142 << 0x30 | uVar5;
  local_430.v[0x45] =
       (uVar5 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + local_430.v[0x74] + uVar152;
  uVar169 = local_430.v[0x45] ^ uVar169;
  local_430.v[0x24] = uVar169 << 1 | (ulong)((long)uVar169 < 0);
  uVar169 = (uVar28 & 0xffffffff | uVar172) * (uVar27 & 0xffffffff | uVar1) * 2 +
            uVar40 + (uVar27 | uVar1);
  uVar27 = (uVar167 << 1 | (ulong)((long)uVar167 < 0)) ^ uVar169;
  uVar5 = uVar27 >> 0x20;
  uVar27 = uVar27 << 0x20 | uVar5;
  uVar65 = uVar5 * (uVar153 & 0xffffffff | uVar183) * 2 + uVar27 + (uVar153 | uVar183);
  uVar40 = uVar40 ^ uVar65;
  uVar5 = uVar40 >> 0x18;
  uVar142 = uVar40 << 0x28 | uVar5;
  uVar160 = (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + uVar142 + uVar169;
  uVar27 = uVar160 ^ uVar27;
  uVar5 = uVar27 >> 0x10;
  uVar28 = uVar27 << 0x30 | uVar5;
  uVar153 = (uVar5 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar28 + uVar65;
  uVar142 = uVar153 ^ uVar142;
  uVar5 = uVar142 << 1;
  uVar169 = (ulong)((long)uVar142 < 0);
  uVar143 = uVar5 | uVar169;
  uVar65 = (uVar130 & 0xffffffff | uVar191) * (uVar26 & 0xffffffff | uVar2) * 2 +
           uVar42 + (uVar26 | uVar2);
  uVar27 = (uVar196 << 1 | (ulong)((long)uVar196 < 0)) ^ uVar65;
  uVar26 = uVar27 >> 0x20;
  uVar27 = uVar27 << 0x20 | uVar26;
  uVar152 = uVar26 * (uVar146 & 0xffffffff | uVar192) * 2 + uVar27 + (uVar146 | uVar192);
  uVar42 = uVar42 ^ uVar152;
  uVar26 = uVar42 >> 0x18;
  uVar142 = uVar42 << 0x28 | uVar26;
  uVar171 = (uVar26 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar142 + uVar65;
  uVar27 = uVar171 ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  uVar66 = uVar27 << 0x30 | uVar26;
  uVar159 = (uVar26 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar66 + uVar152;
  uVar142 = uVar159 ^ uVar142;
  uVar26 = uVar142 << 1;
  uVar65 = (ulong)((long)uVar142 < 0);
  uVar74 = uVar26 | uVar65;
  uVar152 = (uVar73 & 0xffffffff | uVar154) * (uVar188 & 0xffffffff | uVar3) * 2 +
            uVar48 + (uVar188 | uVar3);
  uVar142 = (uVar186 << 1 | (ulong)((long)uVar186 < 0)) ^ uVar152;
  uVar27 = uVar142 >> 0x20;
  uVar142 = uVar142 << 0x20 | uVar27;
  uVar130 = uVar27 * (uVar189 & 0xffffffff | uVar148) * 2 + uVar142 + (uVar189 | uVar148);
  uVar48 = uVar48 ^ uVar130;
  uVar27 = uVar48 >> 0x18;
  uVar188 = uVar48 << 0x28 | uVar27;
  uVar189 = (uVar27 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar188 + uVar152;
  uVar142 = uVar189 ^ uVar142;
  uVar27 = uVar142 >> 0x10;
  uVar69 = uVar142 << 0x30 | uVar27;
  uVar170 = (uVar27 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + uVar69 + uVar130;
  uVar188 = uVar170 ^ uVar188;
  uVar27 = uVar188 << 1;
  uVar188 = (ulong)((long)uVar188 < 0);
  uVar73 = uVar27 | uVar188;
  uVar145 = (uVar72 & 0xffffffff | uVar162) * (uVar145 & 0xffffffff | uVar4) * 2 +
            uVar50 + (uVar145 | uVar4);
  uVar152 = (uVar168 << 1 | (ulong)((long)uVar168 < 0)) ^ uVar145;
  uVar142 = uVar152 >> 0x20;
  uVar130 = uVar152 << 0x20 | uVar142;
  uVar146 = uVar142 * (uVar180 & 0xffffffff | uVar155) * 2 + uVar130 + (uVar180 | uVar155);
  uVar50 = uVar50 ^ uVar146;
  uVar142 = uVar50 >> 0x18;
  uVar72 = uVar50 << 0x28 | uVar142;
  uVar152 = (uVar142 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar72 + uVar145;
  uVar130 = uVar152 ^ uVar130;
  uVar142 = uVar130 >> 0x10;
  uVar130 = uVar130 << 0x30 | uVar142;
  uVar180 = (uVar142 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar72 = uVar180 ^ uVar72;
  uVar142 = uVar72 << 1;
  uVar145 = (ulong)((long)uVar72 < 0);
  uVar72 = uVar142 | uVar145;
  uVar146 = (uVar26 & 0xffffffff | uVar65) * (uVar160 & 0xffffffff) * 2 + uVar74 + uVar160;
  uVar130 = uVar130 ^ uVar146;
  uVar26 = uVar130 >> 0x20;
  uVar65 = uVar130 << 0x20 | uVar26;
  uVar170 = uVar26 * (uVar170 & 0xffffffff) * 2 + uVar65 + uVar170;
  uVar74 = uVar74 ^ uVar170;
  uVar26 = uVar74 >> 0x18;
  uVar130 = uVar74 << 0x28 | uVar26;
  local_430.v[6] = (uVar26 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar65 = local_430.v[6] ^ uVar65;
  uVar26 = uVar65 >> 0x10;
  local_430.v[0x77] = uVar65 << 0x30 | uVar26;
  local_430.v[0x56] =
       (uVar26 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + local_430.v[0x77] + uVar170;
  uVar130 = local_430.v[0x56] ^ uVar130;
  local_430.v[0x27] = uVar130 << 1 | (ulong)((long)uVar130 < 0);
  uVar65 = (uVar27 & 0xffffffff | uVar188) * (uVar171 & 0xffffffff) * 2 + uVar73 + uVar171;
  uVar28 = uVar28 ^ uVar65;
  uVar26 = uVar28 >> 0x20;
  uVar27 = uVar28 << 0x20 | uVar26;
  uVar130 = uVar26 * (uVar180 & 0xffffffff) * 2 + uVar27 + uVar180;
  uVar73 = uVar73 ^ uVar130;
  uVar26 = uVar73 >> 0x18;
  uVar188 = uVar73 << 0x28 | uVar26;
  local_430.v[7] = (uVar26 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar188 + uVar65;
  uVar27 = local_430.v[7] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x66] = uVar27 << 0x30 | uVar26;
  local_430.v[0x57] =
       (uVar26 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + local_430.v[0x66] + uVar130;
  uVar188 = local_430.v[0x57] ^ uVar188;
  local_430.v[0x36] = uVar188 << 1 | (ulong)((long)uVar188 < 0);
  uVar145 = (uVar142 & 0xffffffff | uVar145) * (uVar189 & 0xffffffff) * 2 + uVar72 + uVar189;
  uVar66 = uVar66 ^ uVar145;
  uVar26 = uVar66 >> 0x20;
  uVar27 = uVar66 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar153 & 0xffffffff) * 2 + uVar27 + uVar153;
  uVar72 = uVar72 ^ uVar188;
  uVar26 = uVar72 >> 0x18;
  uVar142 = uVar72 << 0x28 | uVar26;
  local_430.v[0x16] = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = local_430.v[0x16] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x67] = uVar27 << 0x30 | uVar26;
  local_430.v[0x46] =
       (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + local_430.v[0x67] + uVar188;
  uVar142 = local_430.v[0x46] ^ uVar142;
  local_430.v[0x37] = uVar142 << 1 | (ulong)((long)uVar142 < 0);
  uVar142 = (uVar5 & 0xffffffff | uVar169) * (uVar152 & 0xffffffff) * 2 + uVar143 + uVar152;
  uVar69 = uVar69 ^ uVar142;
  uVar5 = uVar69 >> 0x20;
  uVar26 = uVar69 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar159 & 0xffffffff) * 2 + uVar26 + uVar159;
  uVar143 = uVar143 ^ uVar169;
  uVar5 = uVar143 >> 0x18;
  uVar27 = uVar143 << 0x28 | uVar5;
  local_430.v[0x17] = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = local_430.v[0x17] ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  local_430.v[0x76] = uVar26 << 0x30 | uVar5;
  local_430.v[0x47] =
       (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + local_430.v[0x76] + uVar169;
  uVar27 = local_430.v[0x47] ^ uVar27;
  local_430.v[0x26] = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar142 = (uVar41 & 0xffffffff) * (uVar31 & 0xffffffff) * 2 + uVar41 + uVar31;
  uVar140 = uVar140 ^ uVar142;
  uVar5 = uVar140 >> 0x20;
  uVar26 = uVar140 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar55 & 0xffffffff) * 2 + uVar26 + uVar55;
  uVar5 = (uVar41 ^ uVar169) >> 0x18;
  uVar27 = (uVar41 ^ uVar169) << 0x28 | uVar5;
  uVar189 = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = uVar189 ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  uVar28 = uVar26 << 0x30 | uVar5;
  uVar153 = (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + uVar28 + uVar169;
  uVar27 = uVar153 ^ uVar27;
  uVar5 = uVar27 << 1;
  uVar169 = (ulong)((long)uVar27 < 0);
  uVar143 = uVar5 | uVar169;
  uVar145 = (uVar43 & 0xffffffff) * (uVar32 & 0xffffffff) * 2 + uVar43 + uVar32;
  uVar144 = uVar144 ^ uVar145;
  uVar26 = uVar144 >> 0x20;
  uVar27 = uVar144 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar56 & 0xffffffff) * 2 + uVar27 + uVar56;
  uVar26 = (uVar43 ^ uVar188) >> 0x18;
  uVar142 = (uVar43 ^ uVar188) << 0x28 | uVar26;
  uVar160 = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = uVar160 ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  uVar66 = uVar27 << 0x30 | uVar26;
  uVar159 = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar66 + uVar188;
  uVar142 = uVar159 ^ uVar142;
  uVar26 = uVar142 << 1;
  uVar145 = (ulong)((long)uVar142 < 0);
  uVar72 = uVar26 | uVar145;
  uVar65 = (uVar49 & 0xffffffff) * (uVar35 & 0xffffffff) * 2 + uVar49 + uVar35;
  uVar151 = uVar151 ^ uVar65;
  uVar27 = uVar151 >> 0x20;
  uVar142 = uVar151 << 0x20 | uVar27;
  uVar152 = uVar27 * (uVar59 & 0xffffffff) * 2 + uVar142 + uVar59;
  uVar27 = (uVar49 ^ uVar152) >> 0x18;
  uVar188 = (uVar49 ^ uVar152) << 0x28 | uVar27;
  uVar171 = (uVar27 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar188 + uVar65;
  uVar142 = uVar171 ^ uVar142;
  uVar27 = uVar142 >> 0x10;
  uVar69 = uVar142 << 0x30 | uVar27;
  uVar170 = (uVar27 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar69 + uVar152;
  uVar188 = uVar170 ^ uVar188;
  uVar27 = uVar188 << 1;
  uVar188 = (ulong)((long)uVar188 < 0);
  uVar73 = uVar27 | uVar188;
  uVar65 = (uVar51 & 0xffffffff) * (uVar36 & 0xffffffff) * 2 + uVar51 + uVar36;
  uVar71 = uVar71 ^ uVar65;
  uVar142 = uVar71 >> 0x20;
  uVar130 = uVar71 << 0x20 | uVar142;
  uVar146 = uVar142 * (uVar60 & 0xffffffff) * 2 + uVar130 + uVar60;
  uVar142 = (uVar51 ^ uVar146) >> 0x18;
  uVar74 = (uVar51 ^ uVar146) << 0x28 | uVar142;
  uVar152 = (uVar142 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar74 + uVar65;
  uVar130 = uVar152 ^ uVar130;
  uVar142 = uVar130 >> 0x10;
  uVar130 = uVar130 << 0x30 | uVar142;
  uVar180 = (uVar142 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar74 = uVar180 ^ uVar74;
  uVar142 = uVar74 << 1;
  uVar65 = (ulong)((long)uVar74 < 0);
  uVar74 = uVar142 | uVar65;
  uVar146 = (uVar26 & 0xffffffff | uVar145) * (uVar189 & 0xffffffff) * 2 + uVar72 + uVar189;
  uVar130 = uVar130 ^ uVar146;
  uVar26 = uVar130 >> 0x20;
  uVar145 = uVar130 << 0x20 | uVar26;
  uVar170 = uVar26 * (uVar170 & 0xffffffff) * 2 + uVar145 + uVar170;
  uVar72 = uVar72 ^ uVar170;
  uVar26 = uVar72 >> 0x18;
  uVar130 = uVar72 << 0x28 | uVar26;
  local_430.v[8] = (uVar26 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar145 = local_430.v[8] ^ uVar145;
  uVar26 = uVar145 >> 0x10;
  local_430.v[0x79] = uVar145 << 0x30 | uVar26;
  local_430.v[0x58] =
       (uVar26 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + local_430.v[0x79] + uVar170;
  uVar130 = local_430.v[0x58] ^ uVar130;
  local_430.v[0x29] = uVar130 << 1 | (ulong)((long)uVar130 < 0);
  uVar188 = (uVar27 & 0xffffffff | uVar188) * (uVar160 & 0xffffffff) * 2 + uVar73 + uVar160;
  uVar28 = uVar28 ^ uVar188;
  uVar26 = uVar28 >> 0x20;
  uVar27 = uVar28 << 0x20 | uVar26;
  uVar130 = uVar26 * (uVar180 & 0xffffffff) * 2 + uVar27 + uVar180;
  uVar73 = uVar73 ^ uVar130;
  uVar26 = uVar73 >> 0x18;
  uVar145 = uVar73 << 0x28 | uVar26;
  local_430.v[9] = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar145 + uVar188;
  uVar27 = local_430.v[9] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x68] = uVar27 << 0x30 | uVar26;
  local_430.v[0x59] =
       (uVar26 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + local_430.v[0x68] + uVar130;
  uVar145 = local_430.v[0x59] ^ uVar145;
  local_430.v[0x38] = uVar145 << 1 | (ulong)((long)uVar145 < 0);
  uVar145 = (uVar142 & 0xffffffff | uVar65) * (uVar171 & 0xffffffff) * 2 + uVar74 + uVar171;
  uVar66 = uVar66 ^ uVar145;
  uVar26 = uVar66 >> 0x20;
  uVar27 = uVar66 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar153 & 0xffffffff) * 2 + uVar27 + uVar153;
  uVar74 = uVar74 ^ uVar188;
  uVar26 = uVar74 >> 0x18;
  uVar142 = uVar74 << 0x28 | uVar26;
  local_430.v[0x18] = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = local_430.v[0x18] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x69] = uVar27 << 0x30 | uVar26;
  local_430.v[0x48] =
       (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + local_430.v[0x69] + uVar188;
  uVar142 = local_430.v[0x48] ^ uVar142;
  local_430.v[0x39] = uVar142 << 1 | (ulong)((long)uVar142 < 0);
  uVar142 = (uVar5 & 0xffffffff | uVar169) * (uVar152 & 0xffffffff) * 2 + uVar143 + uVar152;
  uVar69 = uVar69 ^ uVar142;
  uVar5 = uVar69 >> 0x20;
  uVar26 = uVar69 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar159 & 0xffffffff) * 2 + uVar26 + uVar159;
  uVar143 = uVar143 ^ uVar169;
  uVar5 = uVar143 >> 0x18;
  uVar27 = uVar143 << 0x28 | uVar5;
  local_430.v[0x19] = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = local_430.v[0x19] ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  local_430.v[0x78] = uVar26 << 0x30 | uVar5;
  local_430.v[0x49] =
       (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + local_430.v[0x78] + uVar169;
  uVar27 = local_430.v[0x49] ^ uVar27;
  local_430.v[0x28] = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar142 = (uVar37 & 0xffffffff) * (uVar29 & 0xffffffff) * 2 + uVar37 + uVar29;
  uVar62 = uVar62 ^ uVar142;
  uVar5 = uVar62 >> 0x20;
  uVar26 = uVar62 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar53 & 0xffffffff) * 2 + uVar26 + uVar53;
  uVar5 = (uVar37 ^ uVar169) >> 0x18;
  uVar27 = (uVar37 ^ uVar169) << 0x28 | uVar5;
  uVar189 = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = uVar189 ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  uVar28 = uVar26 << 0x30 | uVar5;
  uVar153 = (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + uVar28 + uVar169;
  uVar27 = uVar153 ^ uVar27;
  uVar5 = uVar27 << 1;
  uVar169 = (ulong)((long)uVar27 < 0);
  uVar143 = uVar5 | uVar169;
  uVar145 = (uVar39 & 0xffffffff) * (uVar30 & 0xffffffff) * 2 + uVar39 + uVar30;
  uVar166 = uVar166 ^ uVar145;
  uVar26 = uVar166 >> 0x20;
  uVar27 = uVar166 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar54 & 0xffffffff) * 2 + uVar27 + uVar54;
  uVar26 = (uVar39 ^ uVar188) >> 0x18;
  uVar142 = (uVar39 ^ uVar188) << 0x28 | uVar26;
  uVar160 = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = uVar160 ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  uVar66 = uVar27 << 0x30 | uVar26;
  uVar159 = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar66 + uVar188;
  uVar142 = uVar159 ^ uVar142;
  uVar26 = uVar142 << 1;
  uVar145 = (ulong)((long)uVar142 < 0);
  uVar72 = uVar26 | uVar145;
  uVar65 = (uVar45 & 0xffffffff) * (uVar33 & 0xffffffff) * 2 + uVar45 + uVar33;
  uVar157 = uVar157 ^ uVar65;
  uVar27 = uVar157 >> 0x20;
  uVar142 = uVar157 << 0x20 | uVar27;
  uVar152 = uVar27 * (uVar57 & 0xffffffff) * 2 + uVar142 + uVar57;
  uVar27 = (uVar45 ^ uVar152) >> 0x18;
  uVar188 = (uVar45 ^ uVar152) << 0x28 | uVar27;
  uVar171 = (uVar27 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar188 + uVar65;
  uVar142 = uVar171 ^ uVar142;
  uVar27 = uVar142 >> 0x10;
  uVar69 = uVar142 << 0x30 | uVar27;
  uVar170 = (uVar27 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar69 + uVar152;
  uVar188 = uVar170 ^ uVar188;
  uVar27 = uVar188 << 1;
  uVar188 = (ulong)((long)uVar188 < 0);
  uVar73 = uVar27 | uVar188;
  uVar65 = (uVar47 & 0xffffffff) * (uVar34 & 0xffffffff) * 2 + uVar47 + uVar34;
  uVar178 = uVar178 ^ uVar65;
  uVar142 = uVar178 >> 0x20;
  uVar130 = uVar178 << 0x20 | uVar142;
  uVar146 = uVar142 * (uVar58 & 0xffffffff) * 2 + uVar130 + uVar58;
  uVar142 = (uVar47 ^ uVar146) >> 0x18;
  uVar74 = (uVar47 ^ uVar146) << 0x28 | uVar142;
  uVar152 = (uVar142 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar74 + uVar65;
  uVar130 = uVar152 ^ uVar130;
  uVar142 = uVar130 >> 0x10;
  uVar130 = uVar130 << 0x30 | uVar142;
  uVar180 = (uVar142 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar74 = uVar180 ^ uVar74;
  uVar142 = uVar74 << 1;
  uVar65 = (ulong)((long)uVar74 < 0);
  uVar74 = uVar142 | uVar65;
  uVar146 = (uVar26 & 0xffffffff | uVar145) * (uVar189 & 0xffffffff) * 2 + uVar72 + uVar189;
  uVar130 = uVar130 ^ uVar146;
  uVar26 = uVar130 >> 0x20;
  uVar145 = uVar130 << 0x20 | uVar26;
  uVar170 = uVar26 * (uVar170 & 0xffffffff) * 2 + uVar145 + uVar170;
  uVar72 = uVar72 ^ uVar170;
  uVar26 = uVar72 >> 0x18;
  uVar130 = uVar72 << 0x28 | uVar26;
  local_430.v[10] = (uVar26 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar145 = local_430.v[10] ^ uVar145;
  uVar26 = uVar145 >> 0x10;
  local_430.v[0x7b] = uVar145 << 0x30 | uVar26;
  local_430.v[0x5a] =
       (uVar26 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + local_430.v[0x7b] + uVar170;
  uVar130 = local_430.v[0x5a] ^ uVar130;
  local_430.v[0x2b] = uVar130 << 1 | (ulong)((long)uVar130 < 0);
  uVar188 = (uVar27 & 0xffffffff | uVar188) * (uVar160 & 0xffffffff) * 2 + uVar73 + uVar160;
  uVar28 = uVar28 ^ uVar188;
  uVar26 = uVar28 >> 0x20;
  uVar27 = uVar28 << 0x20 | uVar26;
  uVar130 = uVar26 * (uVar180 & 0xffffffff) * 2 + uVar27 + uVar180;
  uVar73 = uVar73 ^ uVar130;
  uVar26 = uVar73 >> 0x18;
  uVar145 = uVar73 << 0x28 | uVar26;
  local_430.v[0xb] = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar145 + uVar188;
  uVar27 = local_430.v[0xb] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x6a] = uVar27 << 0x30 | uVar26;
  local_430.v[0x5b] =
       (uVar26 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + local_430.v[0x6a] + uVar130;
  uVar145 = local_430.v[0x5b] ^ uVar145;
  local_430.v[0x3a] = uVar145 << 1 | (ulong)((long)uVar145 < 0);
  uVar145 = (uVar142 & 0xffffffff | uVar65) * (uVar171 & 0xffffffff) * 2 + uVar74 + uVar171;
  uVar66 = uVar66 ^ uVar145;
  uVar26 = uVar66 >> 0x20;
  uVar27 = uVar66 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar153 & 0xffffffff) * 2 + uVar27 + uVar153;
  uVar74 = uVar74 ^ uVar188;
  uVar26 = uVar74 >> 0x18;
  uVar142 = uVar74 << 0x28 | uVar26;
  local_430.v[0x1a] = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = local_430.v[0x1a] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x6b] = uVar27 << 0x30 | uVar26;
  local_430.v[0x4a] =
       (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + local_430.v[0x6b] + uVar188;
  uVar142 = local_430.v[0x4a] ^ uVar142;
  local_430.v[0x3b] = uVar142 << 1 | (ulong)((long)uVar142 < 0);
  uVar142 = (uVar5 & 0xffffffff | uVar169) * (uVar152 & 0xffffffff) * 2 + uVar143 + uVar152;
  uVar69 = uVar69 ^ uVar142;
  uVar5 = uVar69 >> 0x20;
  uVar26 = uVar69 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar159 & 0xffffffff) * 2 + uVar26 + uVar159;
  uVar143 = uVar143 ^ uVar169;
  uVar5 = uVar143 >> 0x18;
  uVar27 = uVar143 << 0x28 | uVar5;
  local_430.v[0x1b] = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = local_430.v[0x1b] ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  local_430.v[0x7a] = uVar26 << 0x30 | uVar5;
  local_430.v[0x4b] =
       (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + local_430.v[0x7a] + uVar169;
  uVar27 = local_430.v[0x4b] ^ uVar27;
  local_430.v[0x2a] = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar142 = (uVar15 & 0xffffffff) * (uVar7 & 0xffffffff) * 2 + uVar90 + uVar76;
  uVar195 = uVar195 ^ uVar142;
  uVar5 = uVar195 >> 0x20;
  uVar26 = uVar195 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar23 & 0xffffffff) * 2 + uVar26 + uVar104;
  uVar5 = (uVar90 ^ uVar169) >> 0x18;
  uVar27 = (uVar90 ^ uVar169) << 0x28 | uVar5;
  uVar189 = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = uVar189 ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  uVar28 = uVar26 << 0x30 | uVar5;
  uVar153 = (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + uVar28 + uVar169;
  uVar27 = uVar153 ^ uVar27;
  uVar5 = uVar27 << 1;
  uVar169 = (ulong)((long)uVar27 < 0);
  uVar143 = uVar5 | uVar169;
  uVar145 = (uVar16 & 0xffffffff) * (uVar8 & 0xffffffff) * 2 + uVar92 + uVar78;
  uVar120 = uVar120 ^ uVar145;
  uVar26 = uVar120 >> 0x20;
  uVar27 = uVar120 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar24 & 0xffffffff) * 2 + uVar27 + uVar106;
  uVar26 = (uVar92 ^ uVar188) >> 0x18;
  uVar142 = (uVar92 ^ uVar188) << 0x28 | uVar26;
  uVar160 = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = uVar160 ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  uVar66 = uVar27 << 0x30 | uVar26;
  uVar159 = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar66 + uVar188;
  uVar142 = uVar159 ^ uVar142;
  uVar26 = uVar142 << 1;
  uVar145 = (ulong)((long)uVar142 < 0);
  uVar72 = uVar26 | uVar145;
  uVar65 = (uVar19 & 0xffffffff) * (uVar11 & 0xffffffff) * 2 + uVar97 + uVar83;
  uVar176 = uVar176 ^ uVar65;
  uVar27 = uVar176 >> 0x20;
  uVar142 = uVar176 << 0x20 | uVar27;
  uVar152 = uVar27 * (uVar156 & 0xffffffff) * 2 + uVar142 + uVar112;
  uVar27 = (uVar97 ^ uVar152) >> 0x18;
  uVar188 = (uVar97 ^ uVar152) << 0x28 | uVar27;
  uVar171 = (uVar27 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar188 + uVar65;
  uVar142 = uVar171 ^ uVar142;
  uVar27 = uVar142 >> 0x10;
  uVar69 = uVar142 << 0x30 | uVar27;
  uVar170 = (uVar27 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar69 + uVar152;
  uVar188 = uVar170 ^ uVar188;
  uVar27 = uVar188 << 1;
  uVar188 = (ulong)((long)uVar188 < 0);
  uVar73 = uVar27 | uVar188;
  uVar65 = (uVar20 & 0xffffffff) * (uVar12 & 0xffffffff) * 2 + uVar99 + uVar85;
  uVar122 = uVar122 ^ uVar65;
  uVar142 = uVar122 >> 0x20;
  uVar130 = uVar122 << 0x20 | uVar142;
  uVar146 = uVar142 * (uVar164 & 0xffffffff) * 2 + uVar130 + uVar114;
  uVar142 = (uVar99 ^ uVar146) >> 0x18;
  uVar74 = (uVar99 ^ uVar146) << 0x28 | uVar142;
  uVar152 = (uVar142 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar74 + uVar65;
  uVar130 = uVar152 ^ uVar130;
  uVar142 = uVar130 >> 0x10;
  uVar130 = uVar130 << 0x30 | uVar142;
  uVar180 = (uVar142 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar74 = uVar180 ^ uVar74;
  uVar142 = uVar74 << 1;
  uVar65 = (ulong)((long)uVar74 < 0);
  uVar74 = uVar142 | uVar65;
  uVar146 = (uVar26 & 0xffffffff | uVar145) * (uVar189 & 0xffffffff) * 2 + uVar72 + uVar189;
  uVar130 = uVar130 ^ uVar146;
  uVar26 = uVar130 >> 0x20;
  uVar145 = uVar130 << 0x20 | uVar26;
  uVar170 = uVar26 * (uVar170 & 0xffffffff) * 2 + uVar145 + uVar170;
  uVar72 = uVar72 ^ uVar170;
  uVar26 = uVar72 >> 0x18;
  uVar130 = uVar72 << 0x28 | uVar26;
  local_430.v[0xc] = (uVar26 & 0xffffffff) * (uVar146 & 0xffffffff) * 2 + uVar130 + uVar146;
  uVar145 = local_430.v[0xc] ^ uVar145;
  uVar26 = uVar145 >> 0x10;
  local_430.v[0x7d] = uVar145 << 0x30 | uVar26;
  local_430.v[0x5c] =
       (uVar26 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + local_430.v[0x7d] + uVar170;
  uVar130 = local_430.v[0x5c] ^ uVar130;
  local_430.v[0x2d] = uVar130 << 1 | (ulong)((long)uVar130 < 0);
  uVar188 = (uVar27 & 0xffffffff | uVar188) * (uVar160 & 0xffffffff) * 2 + uVar73 + uVar160;
  uVar28 = uVar28 ^ uVar188;
  uVar26 = uVar28 >> 0x20;
  uVar27 = uVar28 << 0x20 | uVar26;
  uVar130 = uVar26 * (uVar180 & 0xffffffff) * 2 + uVar27 + uVar180;
  uVar73 = uVar73 ^ uVar130;
  uVar26 = uVar73 >> 0x18;
  uVar145 = uVar73 << 0x28 | uVar26;
  local_430.v[0xd] = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar145 + uVar188;
  uVar27 = local_430.v[0xd] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x6c] = uVar27 << 0x30 | uVar26;
  local_430.v[0x5d] =
       (uVar26 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + local_430.v[0x6c] + uVar130;
  uVar145 = local_430.v[0x5d] ^ uVar145;
  local_430.v[0x3c] = uVar145 << 1 | (ulong)((long)uVar145 < 0);
  uVar145 = (uVar142 & 0xffffffff | uVar65) * (uVar171 & 0xffffffff) * 2 + uVar74 + uVar171;
  uVar66 = uVar66 ^ uVar145;
  uVar26 = uVar66 >> 0x20;
  uVar27 = uVar66 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar153 & 0xffffffff) * 2 + uVar27 + uVar153;
  uVar74 = uVar74 ^ uVar188;
  uVar26 = uVar74 >> 0x18;
  uVar142 = uVar74 << 0x28 | uVar26;
  local_430.v[0x1c] = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = local_430.v[0x1c] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x6d] = uVar27 << 0x30 | uVar26;
  local_430.v[0x4c] =
       (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + local_430.v[0x6d] + uVar188;
  uVar142 = local_430.v[0x4c] ^ uVar142;
  local_430.v[0x3d] = uVar142 << 1 | (ulong)((long)uVar142 < 0);
  uVar142 = (uVar5 & 0xffffffff | uVar169) * (uVar152 & 0xffffffff) * 2 + uVar143 + uVar152;
  uVar69 = uVar69 ^ uVar142;
  uVar5 = uVar69 >> 0x20;
  uVar26 = uVar69 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar159 & 0xffffffff) * 2 + uVar26 + uVar159;
  uVar143 = uVar143 ^ uVar169;
  uVar5 = uVar143 >> 0x18;
  uVar27 = uVar143 << 0x28 | uVar5;
  local_430.v[0x1d] = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = local_430.v[0x1d] ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  local_430.v[0x7c] = uVar26 << 0x30 | uVar5;
  local_430.v[0x4d] =
       (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + local_430.v[0x7c] + uVar169;
  uVar27 = local_430.v[0x4d] ^ uVar27;
  local_430.v[0x2c] = uVar27 << 1 | (ulong)((long)uVar27 < 0);
  uVar142 = (uVar17 & 0xffffffff) * (uVar9 & 0xffffffff) * 2 + uVar94 + uVar80;
  uVar121 = uVar121 ^ uVar142;
  uVar5 = uVar121 >> 0x20;
  uVar26 = uVar121 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar25 & 0xffffffff) * 2 + uVar26 + uVar108;
  uVar5 = (uVar94 ^ uVar169) >> 0x18;
  uVar27 = (uVar94 ^ uVar169) << 0x28 | uVar5;
  uVar189 = (uVar5 & 0xffffffff) * (uVar142 & 0xffffffff) * 2 + uVar27 + uVar142;
  uVar26 = uVar189 ^ uVar26;
  uVar5 = uVar26 >> 0x10;
  uVar28 = uVar26 << 0x30 | uVar5;
  uVar153 = (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + uVar28 + uVar169;
  uVar27 = uVar153 ^ uVar27;
  uVar5 = uVar27 << 1;
  uVar169 = (ulong)((long)uVar27 < 0);
  uVar146 = uVar5 | uVar169;
  uVar145 = (uVar14 & 0xffffffff) * (uVar6 & 0xffffffff) * 2 + uVar133 + uVar131;
  uVar70 = uVar70 ^ uVar145;
  uVar26 = uVar70 >> 0x20;
  uVar27 = uVar70 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar22 & 0xffffffff) * 2 + uVar27 + uVar137;
  uVar26 = (uVar133 ^ uVar188) >> 0x18;
  uVar142 = (uVar133 ^ uVar188) << 0x28 | uVar26;
  uVar160 = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = uVar160 ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  uVar66 = uVar27 << 0x30 | uVar26;
  uVar159 = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar66 + uVar188;
  uVar142 = uVar159 ^ uVar142;
  uVar26 = uVar142 << 1;
  uVar145 = (ulong)((long)uVar142 < 0);
  uVar69 = uVar26 | uVar145;
  uVar65 = (uVar21 & 0xffffffff) * (uVar13 & 0xffffffff) * 2 + uVar101 + uVar87;
  uVar64 = uVar64 ^ uVar65;
  uVar27 = uVar64 >> 0x20;
  uVar142 = uVar64 << 0x20 | uVar27;
  uVar152 = uVar27 * (uVar138 & 0xffffffff) * 2 + uVar142 + uVar116;
  uVar27 = (uVar101 ^ uVar152) >> 0x18;
  uVar188 = (uVar101 ^ uVar152) << 0x28 | uVar27;
  uVar171 = (uVar27 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar188 + uVar65;
  uVar142 = uVar171 ^ uVar142;
  uVar27 = uVar142 >> 0x10;
  uVar74 = uVar142 << 0x30 | uVar27;
  uVar170 = (uVar27 & 0xffffffff) * (uVar152 & 0xffffffff) * 2 + uVar74 + uVar152;
  uVar188 = uVar170 ^ uVar188;
  uVar27 = uVar188 << 1;
  uVar188 = (ulong)((long)uVar188 < 0);
  uVar72 = uVar27 | uVar188;
  uVar65 = (uVar18 & 0xffffffff) * (uVar10 & 0xffffffff) * 2 + uVar135 + uVar132;
  uVar175 = uVar175 ^ uVar65;
  uVar142 = uVar175 >> 0x20;
  uVar130 = uVar175 << 0x20 | uVar142;
  uVar143 = uVar142 * (uVar149 & 0xffffffff) * 2 + uVar130 + uVar139;
  uVar142 = (uVar135 ^ uVar143) >> 0x18;
  uVar73 = (uVar135 ^ uVar143) << 0x28 | uVar142;
  uVar152 = (uVar142 & 0xffffffff) * (uVar65 & 0xffffffff) * 2 + uVar73 + uVar65;
  uVar130 = uVar152 ^ uVar130;
  uVar142 = uVar130 >> 0x10;
  uVar130 = uVar130 << 0x30 | uVar142;
  uVar180 = (uVar142 & 0xffffffff) * (uVar143 & 0xffffffff) * 2 + uVar130 + uVar143;
  uVar73 = uVar180 ^ uVar73;
  uVar142 = uVar73 << 1;
  uVar65 = (ulong)((long)uVar73 < 0);
  uVar73 = uVar142 | uVar65;
  uVar143 = (uVar26 & 0xffffffff | uVar145) * (uVar189 & 0xffffffff) * 2 + uVar69 + uVar189;
  uVar130 = uVar130 ^ uVar143;
  uVar26 = uVar130 >> 0x20;
  uVar145 = uVar130 << 0x20 | uVar26;
  uVar170 = uVar26 * (uVar170 & 0xffffffff) * 2 + uVar145 + uVar170;
  uVar69 = uVar69 ^ uVar170;
  uVar26 = uVar69 >> 0x18;
  uVar130 = uVar69 << 0x28 | uVar26;
  local_430.v[0xe] = (uVar26 & 0xffffffff) * (uVar143 & 0xffffffff) * 2 + uVar130 + uVar143;
  uVar145 = local_430.v[0xe] ^ uVar145;
  uVar26 = uVar145 >> 0x10;
  local_430.v[0x7f] = uVar145 << 0x30 | uVar26;
  local_430.v[0x5e] =
       (uVar26 & 0xffffffff) * (uVar170 & 0xffffffff) * 2 + local_430.v[0x7f] + uVar170;
  uVar130 = local_430.v[0x5e] ^ uVar130;
  local_430.v[0x2f] = uVar130 << 1 | (ulong)((long)uVar130 < 0);
  uVar188 = (uVar27 & 0xffffffff | uVar188) * (uVar160 & 0xffffffff) * 2 + uVar72 + uVar160;
  uVar28 = uVar28 ^ uVar188;
  uVar26 = uVar28 >> 0x20;
  uVar27 = uVar28 << 0x20 | uVar26;
  uVar130 = uVar26 * (uVar180 & 0xffffffff) * 2 + uVar27 + uVar180;
  uVar72 = uVar72 ^ uVar130;
  uVar26 = uVar72 >> 0x18;
  uVar145 = uVar72 << 0x28 | uVar26;
  local_430.v[0xf] = (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + uVar145 + uVar188;
  uVar27 = local_430.v[0xf] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x6e] = uVar27 << 0x30 | uVar26;
  local_430.v[0x5f] =
       (uVar26 & 0xffffffff) * (uVar130 & 0xffffffff) * 2 + local_430.v[0x6e] + uVar130;
  uVar145 = local_430.v[0x5f] ^ uVar145;
  local_430.v[0x3e] = uVar145 << 1 | (ulong)((long)uVar145 < 0);
  uVar145 = (uVar142 & 0xffffffff | uVar65) * (uVar171 & 0xffffffff) * 2 + uVar73 + uVar171;
  uVar66 = uVar66 ^ uVar145;
  uVar26 = uVar66 >> 0x20;
  uVar27 = uVar66 << 0x20 | uVar26;
  uVar188 = uVar26 * (uVar153 & 0xffffffff) * 2 + uVar27 + uVar153;
  uVar73 = uVar73 ^ uVar188;
  uVar26 = uVar73 >> 0x18;
  uVar142 = uVar73 << 0x28 | uVar26;
  local_430.v[0x1e] = (uVar26 & 0xffffffff) * (uVar145 & 0xffffffff) * 2 + uVar142 + uVar145;
  uVar27 = local_430.v[0x1e] ^ uVar27;
  uVar26 = uVar27 >> 0x10;
  local_430.v[0x6f] = uVar27 << 0x30 | uVar26;
  local_430.v[0x4e] =
       (uVar26 & 0xffffffff) * (uVar188 & 0xffffffff) * 2 + local_430.v[0x6f] + uVar188;
  uVar142 = local_430.v[0x4e] ^ uVar142;
  local_430.v[0x3f] = uVar142 << 1 | (ulong)((long)uVar142 < 0);
  uVar26 = (uVar5 & 0xffffffff | uVar169) * (uVar152 & 0xffffffff) * 2 + uVar146 + uVar152;
  uVar74 = uVar74 ^ uVar26;
  uVar5 = uVar74 >> 0x20;
  uVar27 = uVar74 << 0x20 | uVar5;
  uVar169 = uVar5 * (uVar159 & 0xffffffff) * 2 + uVar27 + uVar159;
  uVar146 = uVar146 ^ uVar169;
  uVar5 = uVar146 >> 0x18;
  uVar142 = uVar146 << 0x28 | uVar5;
  local_430.v[0x1f] = (uVar5 & 0xffffffff) * (uVar26 & 0xffffffff) * 2 + uVar26 + uVar142;
  uVar27 = local_430.v[0x1f] ^ uVar27;
  uVar5 = uVar27 >> 0x10;
  local_430.v[0x7e] = uVar27 << 0x30 | uVar5;
  local_430.v[0x4f] =
       (uVar5 & 0xffffffff) * (uVar169 & 0xffffffff) * 2 + local_430.v[0x7e] + uVar169;
  uVar142 = local_430.v[0x4f] ^ uVar142;
  local_430.v[0x2e] = uVar142 << 1 | (ulong)((long)uVar142 < 0);
  copy_block(next_block,&local_830);
  xor_block(next_block,&local_430);
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
                       block *next_block, int with_xor)
{
    block blockR, block_tmp;

    copy_block(&blockR, ref_block);
    xor_block(&blockR, prev_block);
    copy_block(&block_tmp, &blockR);
    if (with_xor) {
        xor_block(&block_tmp, next_block);
    }

    /* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
    (16,17,..31)... finally (112,113,...127) */
    BLAKE2_ROUND_NOMSG1(blockR.v + 0 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 1 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 2 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 3 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 4 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 5 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 6 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 7 * 16);

    /* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
    (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
    BLAKE2_ROUND_NOMSG2(blockR.v + 0 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 1 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 2 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 3 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 4 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 5 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 6 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 7 * 2);

    copy_block(next_block, &block_tmp);
    xor_block(next_block, &blockR);
}